

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  ulong uVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  uint uVar69;
  uint uVar70;
  ulong uVar71;
  long lVar72;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar73;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  ulong uVar74;
  undefined4 uVar75;
  undefined8 in_R9;
  byte bVar76;
  ulong uVar77;
  bool bVar78;
  undefined8 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar82 [16];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar95 [32];
  undefined1 auVar100 [64];
  undefined1 extraout_var_00 [60];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar122;
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar124;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar128;
  undefined1 auVar134 [16];
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar135 [32];
  float fVar145;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar171 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [28];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar217 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [28];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 in_ZMM10 [64];
  float fVar236;
  float fVar247;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar240 [64];
  float fVar248;
  undefined1 auVar249 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b84;
  undefined1 local_b60 [32];
  int local_b24;
  undefined1 local_b20 [32];
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined8 local_9e0;
  undefined4 local_9d8;
  float local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  uint local_9c8;
  uint local_9c4;
  uint local_9c0;
  ulong local_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_8a0;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  
  PVar5 = prim[1];
  uVar71 = (ulong)(byte)PVar5;
  auVar8 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                      *(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  fVar236 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar80._0_4_ = fVar236 * auVar8._0_4_;
  auVar80._4_4_ = fVar236 * auVar8._4_4_;
  auVar80._8_4_ = fVar236 * auVar8._8_4_;
  auVar80._12_4_ = fVar236 * auVar8._12_4_;
  auVar185._0_4_ = fVar236 * (ray->dir).field_0.m128[0];
  auVar185._4_4_ = fVar236 * (ray->dir).field_0.m128[1];
  auVar185._8_4_ = fVar236 * (ray->dir).field_0.m128[2];
  auVar185._12_4_ = fVar236 * (ray->dir).field_0.m128[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar253 = vpmovsxbd_avx2(auVar8);
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar9 = vpmovsxbd_avx2(auVar3);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar117 = vpmovsxbd_avx2(auVar173);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar10 = vpmovsxbd_avx2(auVar189);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 * 0xc + 6);
  auVar11 = vpmovsxbd_avx2(auVar84);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar91 = vpmovsxbd_avx2(auVar220);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar136 = vpmovsxbd_avx2(auVar133);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar71 * 0x13 + 6);
  auVar170 = vpmovsxbd_avx2(auVar4);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar71 * 0x14 + 6);
  auVar182 = vpmovsxbd_avx2(auVar130);
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar261._4_4_ = auVar185._0_4_;
  auVar261._0_4_ = auVar185._0_4_;
  auVar261._8_4_ = auVar185._0_4_;
  auVar261._12_4_ = auVar185._0_4_;
  auVar261._16_4_ = auVar185._0_4_;
  auVar261._20_4_ = auVar185._0_4_;
  auVar261._24_4_ = auVar185._0_4_;
  auVar261._28_4_ = auVar185._0_4_;
  auVar8 = vmovshdup_avx(auVar185);
  uVar79 = auVar8._0_8_;
  auVar269._8_8_ = uVar79;
  auVar269._0_8_ = uVar79;
  auVar269._16_8_ = uVar79;
  auVar269._24_8_ = uVar79;
  auVar8 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar236 = auVar8._0_4_;
  auVar214._0_4_ = fVar236 * auVar117._0_4_;
  fVar128 = auVar8._4_4_;
  auVar214._4_4_ = fVar128 * auVar117._4_4_;
  auVar214._8_4_ = fVar236 * auVar117._8_4_;
  auVar214._12_4_ = fVar128 * auVar117._12_4_;
  auVar214._16_4_ = fVar236 * auVar117._16_4_;
  auVar214._20_4_ = fVar128 * auVar117._20_4_;
  auVar214._28_36_ = in_ZMM10._28_36_;
  auVar214._24_4_ = fVar236 * auVar117._24_4_;
  auVar198._0_4_ = auVar91._0_4_ * fVar236;
  auVar198._4_4_ = auVar91._4_4_ * fVar128;
  auVar198._8_4_ = auVar91._8_4_ * fVar236;
  auVar198._12_4_ = auVar91._12_4_ * fVar128;
  auVar198._16_4_ = auVar91._16_4_ * fVar236;
  auVar198._20_4_ = auVar91._20_4_ * fVar128;
  auVar198._28_36_ = in_ZMM9._28_36_;
  auVar198._24_4_ = auVar91._24_4_ * fVar236;
  auVar205._0_4_ = auVar182._0_4_ * fVar236;
  auVar205._4_4_ = auVar182._4_4_ * fVar128;
  auVar205._8_4_ = auVar182._8_4_ * fVar236;
  auVar205._12_4_ = auVar182._12_4_ * fVar128;
  auVar205._16_4_ = auVar182._16_4_ * fVar236;
  auVar205._20_4_ = auVar182._20_4_ * fVar128;
  auVar205._24_4_ = auVar182._24_4_ * fVar236;
  auVar205._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(auVar214._0_32_,auVar269,auVar9);
  auVar3 = vfmadd231ps_fma(auVar198._0_32_,auVar269,auVar11);
  auVar173 = vfmadd231ps_fma(auVar205,auVar170,auVar269);
  auVar189 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar261,auVar253);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar261,auVar10);
  auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar136,auVar261);
  auVar262._4_4_ = auVar80._0_4_;
  auVar262._0_4_ = auVar80._0_4_;
  auVar262._8_4_ = auVar80._0_4_;
  auVar262._12_4_ = auVar80._0_4_;
  auVar262._16_4_ = auVar80._0_4_;
  auVar262._20_4_ = auVar80._0_4_;
  auVar262._24_4_ = auVar80._0_4_;
  auVar262._28_4_ = auVar80._0_4_;
  auVar8 = vmovshdup_avx(auVar80);
  uVar79 = auVar8._0_8_;
  auVar270._8_8_ = uVar79;
  auVar270._0_8_ = uVar79;
  auVar270._16_8_ = uVar79;
  auVar270._24_8_ = uVar79;
  auVar8 = vshufps_avx(auVar80,auVar80,0xaa);
  fVar236 = auVar8._0_4_;
  auVar194._0_4_ = fVar236 * auVar117._0_4_;
  fVar128 = auVar8._4_4_;
  auVar194._4_4_ = fVar128 * auVar117._4_4_;
  auVar194._8_4_ = fVar236 * auVar117._8_4_;
  auVar194._12_4_ = fVar128 * auVar117._12_4_;
  auVar194._16_4_ = fVar236 * auVar117._16_4_;
  auVar194._20_4_ = fVar128 * auVar117._20_4_;
  auVar194._24_4_ = fVar236 * auVar117._24_4_;
  auVar194._28_4_ = 0;
  auVar12._4_4_ = auVar91._4_4_ * fVar128;
  auVar12._0_4_ = auVar91._0_4_ * fVar236;
  auVar12._8_4_ = auVar91._8_4_ * fVar236;
  auVar12._12_4_ = auVar91._12_4_ * fVar128;
  auVar12._16_4_ = auVar91._16_4_ * fVar236;
  auVar12._20_4_ = auVar91._20_4_ * fVar128;
  auVar12._24_4_ = auVar91._24_4_ * fVar236;
  auVar12._28_4_ = auVar117._28_4_;
  auVar117._4_4_ = auVar182._4_4_ * fVar128;
  auVar117._0_4_ = auVar182._0_4_ * fVar236;
  auVar117._8_4_ = auVar182._8_4_ * fVar236;
  auVar117._12_4_ = auVar182._12_4_ * fVar128;
  auVar117._16_4_ = auVar182._16_4_ * fVar236;
  auVar117._20_4_ = auVar182._20_4_ * fVar128;
  auVar117._24_4_ = auVar182._24_4_ * fVar236;
  auVar117._28_4_ = fVar128;
  auVar8 = vfmadd231ps_fma(auVar194,auVar270,auVar9);
  auVar84 = vfmadd231ps_fma(auVar12,auVar270,auVar11);
  auVar220 = vfmadd231ps_fma(auVar117,auVar270,auVar170);
  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar262,auVar253);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar262,auVar10);
  local_6e0._8_4_ = 0x7fffffff;
  local_6e0._0_8_ = 0x7fffffff7fffffff;
  local_6e0._12_4_ = 0x7fffffff;
  local_6e0._16_4_ = 0x7fffffff;
  local_6e0._20_4_ = 0x7fffffff;
  local_6e0._24_4_ = 0x7fffffff;
  local_6e0._28_4_ = 0x7fffffff;
  auVar220 = vfmadd231ps_fma(ZEXT1632(auVar220),auVar262,auVar136);
  auVar253 = vandps_avx(ZEXT1632(auVar189),local_6e0);
  auVar215._8_4_ = 0x219392ef;
  auVar215._0_8_ = 0x219392ef219392ef;
  auVar215._12_4_ = 0x219392ef;
  auVar215._16_4_ = 0x219392ef;
  auVar215._20_4_ = 0x219392ef;
  auVar215._24_4_ = 0x219392ef;
  auVar215._28_4_ = 0x219392ef;
  auVar253 = vcmpps_avx(auVar253,auVar215,1);
  auVar9 = vblendvps_avx(ZEXT1632(auVar189),auVar215,auVar253);
  auVar253 = vandps_avx(ZEXT1632(auVar3),local_6e0);
  auVar253 = vcmpps_avx(auVar253,auVar215,1);
  auVar117 = vblendvps_avx(ZEXT1632(auVar3),auVar215,auVar253);
  auVar253 = vandps_avx(ZEXT1632(auVar173),local_6e0);
  auVar253 = vcmpps_avx(auVar253,auVar215,1);
  auVar10 = vrcpps_avx(auVar9);
  auVar253 = vblendvps_avx(ZEXT1632(auVar173),auVar215,auVar253);
  auVar216._8_4_ = 0x3f800000;
  auVar216._0_8_ = 0x3f8000003f800000;
  auVar216._12_4_ = 0x3f800000;
  auVar216._16_4_ = 0x3f800000;
  auVar216._20_4_ = 0x3f800000;
  auVar216._24_4_ = 0x3f800000;
  auVar216._28_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar9,auVar10,auVar216);
  auVar9 = vrcpps_avx(auVar117);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar253);
  auVar3 = vfnmadd213ps_fma(auVar117,auVar9,auVar216);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar9,auVar9);
  auVar173 = vfnmadd213ps_fma(auVar253,auVar10,auVar216);
  auVar173 = vfmadd132ps_fma(ZEXT1632(auVar173),auVar10,auVar10);
  auVar253 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar253 = vsubps_avx(auVar253,ZEXT1632(auVar133));
  auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar10._4_4_ = auVar8._4_4_ * auVar253._4_4_;
  auVar10._0_4_ = auVar8._0_4_ * auVar253._0_4_;
  auVar10._8_4_ = auVar8._8_4_ * auVar253._8_4_;
  auVar10._12_4_ = auVar8._12_4_ * auVar253._12_4_;
  auVar10._16_4_ = auVar253._16_4_ * 0.0;
  auVar10._20_4_ = auVar253._20_4_ * 0.0;
  auVar10._24_4_ = auVar253._24_4_ * 0.0;
  auVar10._28_4_ = auVar253._28_4_;
  auVar253 = vcvtdq2ps_avx(auVar9);
  auVar253 = vsubps_avx(auVar253,ZEXT1632(auVar133));
  auVar11._4_4_ = auVar8._4_4_ * auVar253._4_4_;
  auVar11._0_4_ = auVar8._0_4_ * auVar253._0_4_;
  auVar11._8_4_ = auVar8._8_4_ * auVar253._8_4_;
  auVar11._12_4_ = auVar8._12_4_ * auVar253._12_4_;
  auVar11._16_4_ = auVar253._16_4_ * 0.0;
  auVar11._20_4_ = auVar253._20_4_ * 0.0;
  auVar11._24_4_ = auVar253._24_4_ * 0.0;
  auVar11._28_4_ = auVar253._28_4_;
  auVar253 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xe + 6));
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar253 = vsubps_avx(auVar253,ZEXT1632(auVar84));
  auVar114._1_3_ = 0;
  auVar114[0] = PVar5;
  auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar91._4_4_ = auVar3._4_4_ * auVar253._4_4_;
  auVar91._0_4_ = auVar3._0_4_ * auVar253._0_4_;
  auVar91._8_4_ = auVar3._8_4_ * auVar253._8_4_;
  auVar91._12_4_ = auVar3._12_4_ * auVar253._12_4_;
  auVar91._16_4_ = auVar253._16_4_ * 0.0;
  auVar91._20_4_ = auVar253._20_4_ * 0.0;
  auVar91._24_4_ = auVar253._24_4_ * 0.0;
  auVar91._28_4_ = auVar253._28_4_;
  auVar253 = vcvtdq2ps_avx(auVar9);
  auVar253 = vsubps_avx(auVar253,ZEXT1632(auVar84));
  auVar136._4_4_ = auVar3._4_4_ * auVar253._4_4_;
  auVar136._0_4_ = auVar3._0_4_ * auVar253._0_4_;
  auVar136._8_4_ = auVar3._8_4_ * auVar253._8_4_;
  auVar136._12_4_ = auVar3._12_4_ * auVar253._12_4_;
  auVar136._16_4_ = auVar253._16_4_ * 0.0;
  auVar136._20_4_ = auVar253._20_4_ * 0.0;
  auVar136._24_4_ = auVar253._24_4_ * 0.0;
  auVar136._28_4_ = auVar253._28_4_;
  auVar253 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x15 + 6));
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar253 = vsubps_avx(auVar253,ZEXT1632(auVar220));
  auVar170._4_4_ = auVar253._4_4_ * auVar173._4_4_;
  auVar170._0_4_ = auVar253._0_4_ * auVar173._0_4_;
  auVar170._8_4_ = auVar253._8_4_ * auVar173._8_4_;
  auVar170._12_4_ = auVar253._12_4_ * auVar173._12_4_;
  auVar170._16_4_ = auVar253._16_4_ * 0.0;
  auVar170._20_4_ = auVar253._20_4_ * 0.0;
  auVar170._24_4_ = auVar253._24_4_ * 0.0;
  auVar170._28_4_ = auVar253._28_4_;
  auVar253 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x17 + 6));
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar253 = vsubps_avx(auVar253,ZEXT1632(auVar220));
  auVar182._4_4_ = auVar173._4_4_ * auVar253._4_4_;
  auVar182._0_4_ = auVar173._0_4_ * auVar253._0_4_;
  auVar182._8_4_ = auVar173._8_4_ * auVar253._8_4_;
  auVar182._12_4_ = auVar173._12_4_ * auVar253._12_4_;
  auVar182._16_4_ = auVar253._16_4_ * 0.0;
  auVar182._20_4_ = auVar253._20_4_ * 0.0;
  auVar182._24_4_ = auVar253._24_4_ * 0.0;
  auVar182._28_4_ = auVar253._28_4_;
  auVar253 = vpminsd_avx2(auVar10,auVar11);
  auVar9 = vpminsd_avx2(auVar91,auVar136);
  auVar253 = vmaxps_avx(auVar253,auVar9);
  auVar9 = vpminsd_avx2(auVar170,auVar182);
  uVar75 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar223._4_4_ = uVar75;
  auVar223._0_4_ = uVar75;
  auVar223._8_4_ = uVar75;
  auVar223._12_4_ = uVar75;
  auVar223._16_4_ = uVar75;
  auVar223._20_4_ = uVar75;
  auVar223._24_4_ = uVar75;
  auVar223._28_4_ = uVar75;
  auVar9 = vmaxps_avx(auVar9,auVar223);
  auVar253 = vmaxps_avx(auVar253,auVar9);
  local_3c0._4_4_ = auVar253._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar253._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar253._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar253._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar253._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar253._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar253._24_4_ * 0.99999964;
  local_3c0._28_4_ = 0x3f7ffffa;
  auVar253 = vpmaxsd_avx2(auVar10,auVar11);
  auVar9 = vpmaxsd_avx2(auVar91,auVar136);
  auVar253 = vminps_avx(auVar253,auVar9);
  auVar9 = vpmaxsd_avx2(auVar170,auVar182);
  fVar236 = ray->tfar;
  auVar135._4_4_ = fVar236;
  auVar135._0_4_ = fVar236;
  auVar135._8_4_ = fVar236;
  auVar135._12_4_ = fVar236;
  auVar135._16_4_ = fVar236;
  auVar135._20_4_ = fVar236;
  auVar135._24_4_ = fVar236;
  auVar135._28_4_ = fVar236;
  auVar9 = vminps_avx(auVar9,auVar135);
  auVar253 = vminps_avx(auVar253,auVar9);
  auVar9._4_4_ = auVar253._4_4_ * 1.0000004;
  auVar9._0_4_ = auVar253._0_4_ * 1.0000004;
  auVar9._8_4_ = auVar253._8_4_ * 1.0000004;
  auVar9._12_4_ = auVar253._12_4_ * 1.0000004;
  auVar9._16_4_ = auVar253._16_4_ * 1.0000004;
  auVar9._20_4_ = auVar253._20_4_ * 1.0000004;
  auVar9._24_4_ = auVar253._24_4_ * 1.0000004;
  auVar9._28_4_ = auVar253._28_4_;
  auVar114[4] = PVar5;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar5;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar5;
  auVar114._13_3_ = 0;
  auVar114[0x10] = PVar5;
  auVar114._17_3_ = 0;
  auVar114[0x14] = PVar5;
  auVar114._21_3_ = 0;
  auVar114[0x18] = PVar5;
  auVar114._25_3_ = 0;
  auVar114[0x1c] = PVar5;
  auVar114._29_3_ = 0;
  auVar253 = vcmpps_avx(local_3c0,auVar9,2);
  auVar9 = vpcmpgtd_avx2(auVar114,_DAT_01fb4ba0);
  auVar253 = vandps_avx(auVar253,auVar9);
  auVar115._16_16_ = mm_lookupmask_ps._240_16_;
  auVar115._0_16_ = mm_lookupmask_ps._240_16_;
  uVar75 = vmovmskps_avx(auVar253);
  local_808 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar75);
  local_360 = vblendps_avx(auVar115,ZEXT832(0) << 0x20,0x80);
LAB_0136579e:
  if (local_808 == 0) {
LAB_01367c36:
    return local_808 != 0;
  }
  lVar72 = 0;
  for (uVar71 = local_808; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar70 = *(uint *)(prim + 2);
  local_9a8 = (ulong)*(uint *)(prim + lVar72 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar70].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_9a8);
  p_Var7 = pGVar6[1].intersectionFilterN;
  lVar72 = *(long *)&pGVar6[1].time_range.upper;
  auVar8 = *(undefined1 (*) [16])(lVar72 + (long)p_Var7 * uVar71);
  auVar3 = *(undefined1 (*) [16])(lVar72 + (uVar71 + 1) * (long)p_Var7);
  auVar173 = *(undefined1 (*) [16])(lVar72 + (uVar71 + 2) * (long)p_Var7);
  local_810 = local_808 - 1 & local_808;
  auVar189 = *(undefined1 (*) [16])(lVar72 + (uVar71 + 3) * (long)p_Var7);
  if (local_810 != 0) {
    uVar74 = local_810 - 1 & local_810;
    for (uVar71 = local_810; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    }
    if (uVar74 != 0) {
      for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar186._0_4_ = (auVar8._0_4_ + auVar3._0_4_ + auVar173._0_4_ + auVar189._0_4_) * 0.25;
  auVar186._4_4_ = (auVar8._4_4_ + auVar3._4_4_ + auVar173._4_4_ + auVar189._4_4_) * 0.25;
  auVar186._8_4_ = (auVar8._8_4_ + auVar3._8_4_ + auVar173._8_4_ + auVar189._8_4_) * 0.25;
  auVar186._12_4_ = (auVar8._12_4_ + auVar3._12_4_ + auVar173._12_4_ + auVar189._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar84 = vsubps_avx(auVar186,(undefined1  [16])aVar1);
  auVar84 = vdpps_avx(auVar84,(undefined1  [16])aVar2,0x7f);
  auVar220 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar133 = vrcpss_avx(auVar220,auVar220);
  auVar220 = vfnmadd213ss_fma(auVar133,auVar220,ZEXT416(0x40000000));
  fVar236 = auVar133._0_4_ * auVar220._0_4_;
  auVar214 = ZEXT464((uint)fVar236);
  fVar236 = auVar84._0_4_ * fVar236;
  local_820 = ZEXT416((uint)fVar236);
  auVar187._4_4_ = fVar236;
  auVar187._0_4_ = fVar236;
  auVar187._8_4_ = fVar236;
  auVar187._12_4_ = fVar236;
  fStack_6b0 = fVar236;
  _local_6c0 = auVar187;
  fStack_6ac = fVar236;
  fStack_6a8 = fVar236;
  fStack_6a4 = fVar236;
  auVar84 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar187);
  auVar84 = vblendps_avx(auVar84,_DAT_01f45a50,8);
  local_ac0 = vsubps_avx(auVar8,auVar84);
  local_ad0 = vsubps_avx(auVar173,auVar84);
  local_ae0 = vsubps_avx(auVar3,auVar84);
  _local_af0 = vsubps_avx(auVar189,auVar84);
  auVar8 = vmovshdup_avx(local_ac0);
  uVar79 = auVar8._0_8_;
  auVar253._8_8_ = uVar79;
  auVar253._0_8_ = uVar79;
  auVar253._16_8_ = uVar79;
  auVar253._24_8_ = uVar79;
  auVar8 = vshufps_avx(local_ac0,local_ac0,0xaa);
  uVar79 = auVar8._0_8_;
  auVar258._8_8_ = uVar79;
  auVar258._0_8_ = uVar79;
  auVar258._16_8_ = uVar79;
  auVar258._24_8_ = uVar79;
  auVar8 = vshufps_avx(local_ac0,local_ac0,0xff);
  uVar79 = auVar8._0_8_;
  local_a60._8_8_ = uVar79;
  local_a60._0_8_ = uVar79;
  local_a60._16_8_ = uVar79;
  local_a60._24_8_ = uVar79;
  auVar219 = ZEXT3264(local_a60);
  auVar8 = vmovshdup_avx(local_ae0);
  uVar79 = auVar8._0_8_;
  local_960._8_8_ = uVar79;
  local_960._0_8_ = uVar79;
  local_960._16_8_ = uVar79;
  local_960._24_8_ = uVar79;
  auVar272 = ZEXT3264(local_960);
  auVar8 = vshufps_avx(local_ae0,local_ae0,0xaa);
  uVar79 = auVar8._0_8_;
  auVar212._8_8_ = uVar79;
  auVar212._0_8_ = uVar79;
  auVar212._16_8_ = uVar79;
  auVar212._24_8_ = uVar79;
  auVar8 = vshufps_avx(local_ae0,local_ae0,0xff);
  uVar79 = auVar8._0_8_;
  local_b20._8_8_ = uVar79;
  local_b20._0_8_ = uVar79;
  local_b20._16_8_ = uVar79;
  local_b20._24_8_ = uVar79;
  auVar198 = ZEXT3264(local_b20);
  auVar8 = vmovshdup_avx(local_ad0);
  local_1e0 = auVar8._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar8 = vshufps_avx(local_ad0,local_ad0,0xaa);
  local_4c0 = auVar8._0_4_;
  fStack_4bc = auVar8._4_4_;
  auVar8 = vshufps_avx(local_ad0,local_ad0,0xff);
  local_4e0 = auVar8._0_4_;
  fStack_4dc = auVar8._4_4_;
  auVar8 = vmovshdup_avx(_local_af0);
  local_200 = auVar8._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar8 = vshufps_avx(_local_af0,_local_af0,0xaa);
  local_220 = auVar8._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar8 = vshufps_avx(_local_af0,_local_af0,0xff);
  local_240 = auVar8._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar81._0_4_ = aVar2.x * aVar2.x;
  auVar81._4_4_ = aVar2.y * aVar2.y;
  auVar81._8_4_ = aVar2.z * aVar2.z;
  auVar81._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar8 = vshufps_avx(auVar81,auVar81,0xaa);
  uVar75 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_7a0._4_4_ = uVar75;
  local_7a0._0_4_ = uVar75;
  fStack_798 = (float)uVar75;
  fStack_794 = (float)uVar75;
  fStack_790 = (float)uVar75;
  fStack_78c = (float)uVar75;
  fStack_788 = (float)uVar75;
  register0x000014dc = uVar75;
  auVar240 = ZEXT3264(_local_7a0);
  auVar90._0_8_ = auVar8._0_8_;
  auVar90._8_8_ = auVar90._0_8_;
  auVar90._16_8_ = auVar90._0_8_;
  auVar90._24_8_ = auVar90._0_8_;
  auVar8 = vfmadd231ps_fma(auVar90,_local_7a0,_local_7a0);
  uVar75 = *(undefined4 *)&(ray->dir).field_0;
  local_5e0._4_4_ = uVar75;
  local_5e0._0_4_ = uVar75;
  fStack_5d8 = (float)uVar75;
  fStack_5d4 = (float)uVar75;
  fStack_5d0 = (float)uVar75;
  fStack_5cc = (float)uVar75;
  fStack_5c8 = (float)uVar75;
  register0x0000131c = uVar75;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_5e0,_local_5e0);
  uVar71 = 0;
  bVar76 = 0;
  local_b84 = 1;
  local_600 = (ray->dir).field_0.m128[2];
  uVar75 = local_ac0._0_4_;
  local_380._4_4_ = uVar75;
  local_380._0_4_ = uVar75;
  local_380._8_4_ = uVar75;
  local_380._12_4_ = uVar75;
  local_380._16_4_ = uVar75;
  local_380._20_4_ = uVar75;
  local_380._24_4_ = uVar75;
  local_380._28_4_ = uVar75;
  uVar75 = local_ae0._0_4_;
  local_3a0._4_4_ = uVar75;
  local_3a0._0_4_ = uVar75;
  local_3a0._8_4_ = uVar75;
  local_3a0._12_4_ = uVar75;
  local_3a0._16_4_ = uVar75;
  local_3a0._20_4_ = uVar75;
  local_3a0._24_4_ = uVar75;
  local_3a0._28_4_ = uVar75;
  local_500 = local_ad0._0_4_;
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_280 = local_af0._0_4_;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  local_260 = ZEXT1632(auVar8);
  local_520 = vandps_avx(ZEXT1632(auVar8),local_6e0);
  local_5b0 = ZEXT816(0x3f80000000000000);
  local_980 = auVar212;
  local_940 = auVar258;
  local_920 = auVar253;
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  fStack_4b8 = local_4c0;
  fStack_4b4 = fStack_4bc;
  fStack_4b0 = local_4c0;
  fStack_4ac = fStack_4bc;
  fStack_4a8 = local_4c0;
  fStack_4a4 = fStack_4bc;
  do {
    auVar163._8_4_ = 0x3f800000;
    auVar163._0_8_ = 0x3f8000003f800000;
    auVar163._12_4_ = 0x3f800000;
    auVar163._16_4_ = 0x3f800000;
    auVar163._20_4_ = 0x3f800000;
    auVar163._24_4_ = 0x3f800000;
    auVar163._28_4_ = 0x3f800000;
    auVar8 = vmovshdup_avx(local_5b0);
    auVar8 = vsubps_avx(auVar8,local_5b0);
    fVar236 = auVar8._0_4_;
    fVar148 = fVar236 * 0.04761905;
    local_740._0_4_ = local_5b0._0_4_;
    local_740._4_4_ = local_740._0_4_;
    local_740._8_4_ = local_740._0_4_;
    local_740._12_4_ = local_740._0_4_;
    local_740._16_4_ = local_740._0_4_;
    local_740._20_4_ = local_740._0_4_;
    local_740._24_4_ = local_740._0_4_;
    local_740._28_4_ = local_740._0_4_;
    local_760._4_4_ = fVar236;
    local_760._0_4_ = fVar236;
    local_760._8_4_ = fVar236;
    local_760._12_4_ = fVar236;
    local_760._16_4_ = fVar236;
    local_760._20_4_ = fVar236;
    local_760._24_4_ = fVar236;
    local_760._28_4_ = fVar236;
    auVar8 = vfmadd231ps_fma(local_740,local_760,_DAT_01f7b040);
    auVar9 = vsubps_avx(auVar163,ZEXT1632(auVar8));
    fVar236 = auVar8._0_4_;
    auVar254._0_4_ = local_3a0._0_4_ * fVar236;
    fVar128 = auVar8._4_4_;
    auVar254._4_4_ = local_3a0._4_4_ * fVar128;
    fVar241 = auVar8._8_4_;
    auVar254._8_4_ = local_3a0._8_4_ * fVar241;
    fVar143 = auVar8._12_4_;
    auVar254._12_4_ = local_3a0._12_4_ * fVar143;
    auVar254._16_4_ = local_3a0._16_4_ * 0.0;
    auVar254._20_4_ = local_3a0._20_4_ * 0.0;
    auVar254._28_36_ = auVar240._28_36_;
    auVar254._24_4_ = local_3a0._24_4_ * 0.0;
    auVar14._4_4_ = auVar272._4_4_ * fVar128;
    auVar14._0_4_ = auVar272._0_4_ * fVar236;
    auVar14._8_4_ = auVar272._8_4_ * fVar241;
    auVar14._12_4_ = auVar272._12_4_ * fVar143;
    auVar14._16_4_ = auVar272._16_4_ * 0.0;
    auVar14._20_4_ = auVar272._20_4_ * 0.0;
    auVar14._24_4_ = auVar272._24_4_ * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar15._4_4_ = auVar212._4_4_ * fVar128;
    auVar15._0_4_ = auVar212._0_4_ * fVar236;
    auVar15._8_4_ = auVar212._8_4_ * fVar241;
    auVar15._12_4_ = auVar212._12_4_ * fVar143;
    auVar15._16_4_ = auVar212._16_4_ * 0.0;
    auVar15._20_4_ = auVar212._20_4_ * 0.0;
    auVar15._24_4_ = auVar212._24_4_ * 0.0;
    auVar15._28_4_ = auVar212._28_4_;
    auVar240._0_4_ = auVar198._0_4_ * fVar236;
    auVar240._4_4_ = auVar198._4_4_ * fVar128;
    auVar240._8_4_ = auVar198._8_4_ * fVar241;
    auVar240._12_4_ = auVar198._12_4_ * fVar143;
    auVar240._16_4_ = auVar198._16_4_ * 0.0;
    auVar240._20_4_ = auVar198._20_4_ * 0.0;
    auVar240._28_36_ = auVar214._28_36_;
    auVar240._24_4_ = auVar198._24_4_ * 0.0;
    auVar8 = vfmadd231ps_fma(auVar254._0_32_,auVar9,local_380);
    auVar3 = vfmadd231ps_fma(auVar14,auVar9,auVar253);
    auVar173 = vfmadd231ps_fma(auVar15,auVar9,auVar258);
    auVar189 = vfmadd231ps_fma(auVar240._0_32_,auVar9,auVar219._0_32_);
    auVar227._0_4_ = fVar236 * local_500;
    auVar227._4_4_ = fVar128 * fStack_4fc;
    auVar227._8_4_ = fVar241 * fStack_4f8;
    auVar227._12_4_ = fVar143 * fStack_4f4;
    auVar227._16_4_ = fStack_4f0 * 0.0;
    auVar227._20_4_ = fStack_4ec * 0.0;
    auVar227._28_36_ = auVar219._28_36_;
    auVar227._24_4_ = fStack_4e8 * 0.0;
    auVar66._8_8_ = uStack_1d8;
    auVar66._0_8_ = local_1e0;
    auVar66._16_8_ = uStack_1d0;
    auVar66._24_8_ = uStack_1c8;
    auVar219._0_4_ = (float)local_1e0 * fVar236;
    auVar219._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar128;
    auVar219._8_4_ = (float)uStack_1d8 * fVar241;
    auVar219._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar143;
    auVar219._16_4_ = (float)uStack_1d0 * 0.0;
    auVar219._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar219._28_36_ = auVar198._28_36_;
    auVar219._24_4_ = (float)uStack_1c8 * 0.0;
    auVar67._4_4_ = fVar128 * fStack_4bc;
    auVar67._0_4_ = fVar236 * local_4c0;
    auVar67._8_4_ = fVar241 * fStack_4b8;
    auVar67._12_4_ = fVar143 * fStack_4b4;
    auVar67._16_4_ = fStack_4b0 * 0.0;
    auVar67._20_4_ = fStack_4ac * 0.0;
    auVar67._24_4_ = fStack_4a8 * 0.0;
    auVar67._28_4_ = DAT_01f7b040._28_4_;
    auVar164._0_4_ = fVar236 * local_4e0;
    auVar164._4_4_ = fVar128 * fStack_4dc;
    auVar164._8_4_ = fVar241 * fStack_4d8;
    auVar164._12_4_ = fVar143 * fStack_4d4;
    auVar164._16_4_ = fStack_4d0 * 0.0;
    auVar164._20_4_ = fStack_4cc * 0.0;
    auVar164._24_4_ = fStack_4c8 * 0.0;
    auVar164._28_4_ = 0;
    auVar84 = vfmadd231ps_fma(auVar227._0_32_,auVar9,local_3a0);
    auVar220 = vfmadd231ps_fma(auVar219._0_32_,auVar9,auVar272._0_32_);
    auVar133 = vfmadd231ps_fma(auVar67,auVar9,auVar212);
    auVar4 = vfmadd231ps_fma(auVar164,auVar9,auVar198._0_32_);
    auVar16._4_4_ = fVar128 * fStack_27c;
    auVar16._0_4_ = fVar236 * local_280;
    auVar16._8_4_ = fVar241 * fStack_278;
    auVar16._12_4_ = fVar143 * fStack_274;
    auVar16._16_4_ = fStack_270 * 0.0;
    auVar16._20_4_ = fStack_26c * 0.0;
    auVar16._24_4_ = fStack_268 * 0.0;
    auVar16._28_4_ = auVar258._28_4_;
    auVar17._4_4_ = fVar128 * local_200._4_4_;
    auVar17._0_4_ = fVar236 * (float)local_200;
    auVar17._8_4_ = fVar241 * (float)uStack_1f8;
    auVar17._12_4_ = fVar143 * uStack_1f8._4_4_;
    auVar17._16_4_ = (float)uStack_1f0 * 0.0;
    auVar17._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_1e8 * 0.0;
    auVar17._28_4_ = auVar198._28_4_;
    auVar18._28_4_ = auVar272._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar84._12_4_ * fVar143,
                            CONCAT48(auVar84._8_4_ * fVar241,
                                     CONCAT44(auVar84._4_4_ * fVar128,auVar84._0_4_ * fVar236))));
    auVar8 = vfmadd231ps_fma(auVar18,auVar9,ZEXT1632(auVar8));
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar220._12_4_,
                                                CONCAT48(fVar241 * auVar220._8_4_,
                                                         CONCAT44(fVar128 * auVar220._4_4_,
                                                                  fVar236 * auVar220._0_4_)))),
                             auVar9,ZEXT1632(auVar3));
    auVar173 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar133._12_4_,
                                                  CONCAT48(fVar241 * auVar133._8_4_,
                                                           CONCAT44(fVar128 * auVar133._4_4_,
                                                                    fVar236 * auVar133._0_4_)))),
                               auVar9,ZEXT1632(auVar173));
    auVar189 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar4._12_4_,
                                                  CONCAT48(fVar241 * auVar4._8_4_,
                                                           CONCAT44(fVar128 * auVar4._4_4_,
                                                                    fVar236 * auVar4._0_4_)))),
                               auVar9,ZEXT1632(auVar189));
    auVar206._0_4_ = fVar236 * (float)local_220;
    auVar206._4_4_ = fVar128 * local_220._4_4_;
    auVar206._8_4_ = fVar241 * (float)uStack_218;
    auVar206._12_4_ = fVar143 * uStack_218._4_4_;
    auVar206._16_4_ = (float)uStack_210 * 0.0;
    auVar206._20_4_ = uStack_210._4_4_ * 0.0;
    auVar206._24_4_ = (float)uStack_208 * 0.0;
    auVar206._28_4_ = 0;
    auVar61._4_4_ = fStack_4fc;
    auVar61._0_4_ = local_500;
    auVar61._8_4_ = fStack_4f8;
    auVar61._12_4_ = fStack_4f4;
    auVar61._16_4_ = fStack_4f0;
    auVar61._20_4_ = fStack_4ec;
    auVar61._24_4_ = fStack_4e8;
    auVar61._28_4_ = fStack_4e4;
    auVar130 = vfmadd231ps_fma(auVar16,auVar9,auVar61);
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar143,
                                                 CONCAT48(auVar130._8_4_ * fVar241,
                                                          CONCAT44(auVar130._4_4_ * fVar128,
                                                                   auVar130._0_4_ * fVar236)))),
                              auVar9,ZEXT1632(auVar84));
    auVar217._0_4_ = fVar236 * (float)local_240;
    auVar217._4_4_ = fVar128 * local_240._4_4_;
    auVar217._8_4_ = fVar241 * (float)uStack_238;
    auVar217._12_4_ = fVar143 * uStack_238._4_4_;
    auVar217._16_4_ = (float)uStack_230 * 0.0;
    auVar217._20_4_ = uStack_230._4_4_ * 0.0;
    auVar217._24_4_ = (float)uStack_228 * 0.0;
    auVar217._28_4_ = 0;
    auVar130 = vfmadd231ps_fma(auVar17,auVar9,auVar66);
    auVar63._4_4_ = fStack_4bc;
    auVar63._0_4_ = local_4c0;
    auVar63._8_4_ = fStack_4b8;
    auVar63._12_4_ = fStack_4b4;
    auVar63._16_4_ = fStack_4b0;
    auVar63._20_4_ = fStack_4ac;
    auVar63._24_4_ = fStack_4a8;
    auVar63._28_4_ = fStack_4a4;
    auVar80 = vfmadd231ps_fma(auVar206,auVar9,auVar63);
    auVar62._4_4_ = fStack_4dc;
    auVar62._0_4_ = local_4e0;
    auVar62._8_4_ = fStack_4d8;
    auVar62._12_4_ = fStack_4d4;
    auVar62._16_4_ = fStack_4d0;
    auVar62._20_4_ = fStack_4cc;
    auVar62._24_4_ = fStack_4c8;
    auVar62._28_4_ = fStack_4c4;
    auVar185 = vfmadd231ps_fma(auVar217,auVar9,auVar62);
    auVar19._28_4_ = auVar212._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar185._12_4_ * fVar143,
                            CONCAT48(auVar185._8_4_ * fVar241,
                                     CONCAT44(auVar185._4_4_ * fVar128,auVar185._0_4_ * fVar236))));
    auVar220 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar143,
                                                  CONCAT48(auVar130._8_4_ * fVar241,
                                                           CONCAT44(auVar130._4_4_ * fVar128,
                                                                    auVar130._0_4_ * fVar236)))),
                               auVar9,ZEXT1632(auVar220));
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar80._12_4_,
                                                  CONCAT48(fVar241 * auVar80._8_4_,
                                                           CONCAT44(fVar128 * auVar80._4_4_,
                                                                    fVar236 * auVar80._0_4_)))),
                               auVar9,ZEXT1632(auVar133));
    auVar4 = vfmadd231ps_fma(auVar19,auVar9,ZEXT1632(auVar4));
    auVar20._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar143 * auVar133._12_4_,
                            CONCAT48(fVar241 * auVar133._8_4_,
                                     CONCAT44(fVar128 * auVar133._4_4_,fVar236 * auVar133._0_4_))));
    auVar21._28_4_ = local_3a0._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar143,
                            CONCAT48(auVar4._8_4_ * fVar241,
                                     CONCAT44(auVar4._4_4_ * fVar128,auVar4._0_4_ * fVar236))));
    auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar84._12_4_ * fVar143,
                                                  CONCAT48(auVar84._8_4_ * fVar241,
                                                           CONCAT44(auVar84._4_4_ * fVar128,
                                                                    auVar84._0_4_ * fVar236)))),
                               auVar9,ZEXT1632(auVar8));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar220._12_4_ * fVar143,
                                                 CONCAT48(auVar220._8_4_ * fVar241,
                                                          CONCAT44(auVar220._4_4_ * fVar128,
                                                                   auVar220._0_4_ * fVar236)))),
                              auVar9,ZEXT1632(auVar3));
    auVar185 = vfmadd231ps_fma(auVar20,auVar9,ZEXT1632(auVar173));
    auVar81 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar189),auVar9);
    auVar10 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar8));
    auVar9 = vsubps_avx(ZEXT1632(auVar220),ZEXT1632(auVar3));
    auVar253 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar173));
    auVar117 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar189));
    local_720._0_4_ = fVar148 * auVar10._0_4_ * 3.0;
    local_720._4_4_ = fVar148 * auVar10._4_4_ * 3.0;
    local_720._8_4_ = fVar148 * auVar10._8_4_ * 3.0;
    local_720._12_4_ = fVar148 * auVar10._12_4_ * 3.0;
    local_720._16_4_ = fVar148 * auVar10._16_4_ * 3.0;
    local_720._20_4_ = fVar148 * auVar10._20_4_ * 3.0;
    local_720._24_4_ = fVar148 * auVar10._24_4_ * 3.0;
    local_720._28_4_ = 0;
    local_a20._0_4_ = fVar148 * auVar9._0_4_ * 3.0;
    local_a20._4_4_ = fVar148 * auVar9._4_4_ * 3.0;
    local_a20._8_4_ = fVar148 * auVar9._8_4_ * 3.0;
    local_a20._12_4_ = fVar148 * auVar9._12_4_ * 3.0;
    local_a20._16_4_ = fVar148 * auVar9._16_4_ * 3.0;
    local_a20._20_4_ = fVar148 * auVar9._20_4_ * 3.0;
    local_a20._24_4_ = fVar148 * auVar9._24_4_ * 3.0;
    local_a20._28_4_ = 0;
    fVar101 = fVar148 * auVar253._0_4_ * 3.0;
    fVar122 = fVar148 * auVar253._4_4_ * 3.0;
    local_8e0._4_4_ = fVar122;
    local_8e0._0_4_ = fVar101;
    fVar123 = fVar148 * auVar253._8_4_ * 3.0;
    local_8e0._8_4_ = fVar123;
    fVar124 = fVar148 * auVar253._12_4_ * 3.0;
    local_8e0._12_4_ = fVar124;
    fVar125 = fVar148 * auVar253._16_4_ * 3.0;
    local_8e0._16_4_ = fVar125;
    fVar126 = fVar148 * auVar253._20_4_ * 3.0;
    local_8e0._20_4_ = fVar126;
    fVar127 = fVar148 * auVar253._24_4_ * 3.0;
    local_8e0._24_4_ = fVar127;
    local_8e0._28_4_ = auVar10._28_4_;
    fVar128 = fVar148 * auVar117._0_4_ * 3.0;
    fVar143 = fVar148 * auVar117._4_4_ * 3.0;
    auVar22._4_4_ = fVar143;
    auVar22._0_4_ = fVar128;
    fVar144 = fVar148 * auVar117._8_4_ * 3.0;
    auVar22._8_4_ = fVar144;
    fVar145 = fVar148 * auVar117._12_4_ * 3.0;
    auVar22._12_4_ = fVar145;
    fVar146 = fVar148 * auVar117._16_4_ * 3.0;
    auVar22._16_4_ = fVar146;
    fVar147 = fVar148 * auVar117._20_4_ * 3.0;
    auVar22._20_4_ = fVar147;
    fVar148 = fVar148 * auVar117._24_4_ * 3.0;
    auVar22._24_4_ = fVar148;
    auVar22._28_4_ = auVar9._28_4_;
    auVar114 = ZEXT1632(auVar130);
    local_840 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar130));
    _local_860 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar80));
    local_a00 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar185));
    local_300 = vsubps_avx(local_840,auVar114);
    local_2e0 = vsubps_avx(local_a00,ZEXT1632(auVar185));
    fVar236 = local_2e0._0_4_;
    fVar241 = local_2e0._4_4_;
    auVar23._4_4_ = local_720._4_4_ * fVar241;
    auVar23._0_4_ = local_720._0_4_ * fVar236;
    fVar242 = local_2e0._8_4_;
    auVar23._8_4_ = local_720._8_4_ * fVar242;
    fVar243 = local_2e0._12_4_;
    auVar23._12_4_ = local_720._12_4_ * fVar243;
    fVar244 = local_2e0._16_4_;
    auVar23._16_4_ = local_720._16_4_ * fVar244;
    fVar245 = local_2e0._20_4_;
    auVar23._20_4_ = local_720._20_4_ * fVar245;
    fVar246 = local_2e0._24_4_;
    auVar23._24_4_ = local_720._24_4_ * fVar246;
    auVar23._28_4_ = local_840._28_4_;
    auVar8 = vfmsub231ps_fma(auVar23,local_8e0,local_300);
    local_320 = vsubps_avx(_local_860,ZEXT1632(auVar80));
    fVar248 = local_300._0_4_;
    fVar255 = local_300._4_4_;
    auVar24._4_4_ = fVar255 * local_a20._4_4_;
    auVar24._0_4_ = fVar248 * (float)local_a20._0_4_;
    fVar256 = local_300._8_4_;
    auVar24._8_4_ = fVar256 * local_a20._8_4_;
    fVar257 = local_300._12_4_;
    auVar24._12_4_ = fVar257 * local_a20._12_4_;
    fVar266 = local_300._16_4_;
    auVar24._16_4_ = fVar266 * local_a20._16_4_;
    fVar267 = local_300._20_4_;
    auVar24._20_4_ = fVar267 * local_a20._20_4_;
    fVar268 = local_300._24_4_;
    auVar24._24_4_ = fVar268 * local_a20._24_4_;
    auVar24._28_4_ = local_860._28_4_;
    auVar3 = vfmsub231ps_fma(auVar24,local_720,local_320);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * auVar3._12_4_,
                                                CONCAT48(auVar3._8_4_ * auVar3._8_4_,
                                                         CONCAT44(auVar3._4_4_ * auVar3._4_4_,
                                                                  auVar3._0_4_ * auVar3._0_4_)))),
                             ZEXT1632(auVar8),ZEXT1632(auVar8));
    fVar230 = local_320._0_4_;
    auVar165._0_4_ = fVar230 * fVar101;
    fVar231 = local_320._4_4_;
    auVar165._4_4_ = fVar231 * fVar122;
    fVar232 = local_320._8_4_;
    auVar165._8_4_ = fVar232 * fVar123;
    fVar233 = local_320._12_4_;
    auVar165._12_4_ = fVar233 * fVar124;
    fVar234 = local_320._16_4_;
    auVar165._16_4_ = fVar234 * fVar125;
    fVar235 = local_320._20_4_;
    auVar165._20_4_ = fVar235 * fVar126;
    fVar247 = local_320._24_4_;
    auVar165._24_4_ = fVar247 * fVar127;
    auVar165._28_4_ = 0;
    auVar3 = vfmsub231ps_fma(auVar165,local_a20,local_2e0);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar3),ZEXT1632(auVar3));
    auVar166._0_4_ = fVar236 * fVar236;
    auVar166._4_4_ = fVar241 * fVar241;
    auVar166._8_4_ = fVar242 * fVar242;
    auVar166._12_4_ = fVar243 * fVar243;
    auVar166._16_4_ = fVar244 * fVar244;
    auVar166._20_4_ = fVar245 * fVar245;
    auVar166._24_4_ = fVar246 * fVar246;
    auVar166._28_4_ = 0;
    auVar8 = vfmadd231ps_fma(auVar166,local_320,local_320);
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar8),local_300,local_300);
    auVar253 = vrcpps_avx(ZEXT1632(auVar173));
    auVar259._8_4_ = 0x3f800000;
    auVar259._0_8_ = 0x3f8000003f800000;
    auVar259._12_4_ = 0x3f800000;
    auVar259._16_4_ = 0x3f800000;
    auVar259._20_4_ = 0x3f800000;
    auVar259._24_4_ = 0x3f800000;
    auVar259._28_4_ = 0x3f800000;
    auVar8 = vfnmadd213ps_fma(auVar253,ZEXT1632(auVar173),auVar259);
    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar253,auVar253);
    local_900 = vpermps_avx2(_DAT_01fb7720,local_720);
    local_a40 = vpermps_avx2(_DAT_01fb7720,local_8e0);
    auVar25._4_4_ = local_900._4_4_ * fVar241;
    auVar25._0_4_ = local_900._0_4_ * fVar236;
    auVar25._8_4_ = local_900._8_4_ * fVar242;
    auVar25._12_4_ = local_900._12_4_ * fVar243;
    auVar25._16_4_ = local_900._16_4_ * fVar244;
    auVar25._20_4_ = local_900._20_4_ * fVar245;
    auVar25._24_4_ = local_900._24_4_ * fVar246;
    auVar25._28_4_ = auVar253._28_4_;
    auVar189 = vfmsub231ps_fma(auVar25,local_a40,local_300);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,local_a20);
    auVar26._4_4_ = fVar255 * local_9a0._4_4_;
    auVar26._0_4_ = fVar248 * local_9a0._0_4_;
    auVar26._8_4_ = fVar256 * local_9a0._8_4_;
    auVar26._12_4_ = fVar257 * local_9a0._12_4_;
    auVar26._16_4_ = fVar266 * local_9a0._16_4_;
    auVar26._20_4_ = fVar267 * local_9a0._20_4_;
    auVar26._24_4_ = fVar268 * local_9a0._24_4_;
    auVar26._28_4_ = 0;
    auVar84 = vfmsub231ps_fma(auVar26,local_900,local_320);
    auVar189 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar84._12_4_ * auVar84._12_4_,
                                                  CONCAT48(auVar84._8_4_ * auVar84._8_4_,
                                                           CONCAT44(auVar84._4_4_ * auVar84._4_4_,
                                                                    auVar84._0_4_ * auVar84._0_4_)))
                                       ),ZEXT1632(auVar189),ZEXT1632(auVar189));
    auVar195._0_4_ = fVar230 * local_a40._0_4_;
    auVar195._4_4_ = fVar231 * local_a40._4_4_;
    auVar195._8_4_ = fVar232 * local_a40._8_4_;
    auVar195._12_4_ = fVar233 * local_a40._12_4_;
    auVar195._16_4_ = fVar234 * local_a40._16_4_;
    auVar195._20_4_ = fVar235 * local_a40._20_4_;
    auVar195._24_4_ = fVar247 * local_a40._24_4_;
    auVar195._28_4_ = 0;
    auVar84 = vfmsub231ps_fma(auVar195,local_9a0,local_2e0);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),ZEXT1632(auVar84),ZEXT1632(auVar84));
    auVar253 = vmaxps_avx(ZEXT1632(CONCAT412(auVar8._12_4_ * auVar3._12_4_,
                                             CONCAT48(auVar8._8_4_ * auVar3._8_4_,
                                                      CONCAT44(auVar8._4_4_ * auVar3._4_4_,
                                                               auVar8._0_4_ * auVar3._0_4_)))),
                          ZEXT1632(CONCAT412(auVar189._12_4_ * auVar8._12_4_,
                                             CONCAT48(auVar189._8_4_ * auVar8._8_4_,
                                                      CONCAT44(auVar189._4_4_ * auVar8._4_4_,
                                                               auVar189._0_4_ * auVar8._0_4_)))));
    auVar179._0_4_ = auVar81._0_4_ + fVar128;
    auVar179._4_4_ = auVar81._4_4_ + fVar143;
    auVar179._8_4_ = auVar81._8_4_ + fVar144;
    auVar179._12_4_ = auVar81._12_4_ + fVar145;
    auVar179._16_4_ = fVar146 + 0.0;
    auVar179._20_4_ = fVar147 + 0.0;
    auVar179._24_4_ = fVar148 + 0.0;
    auVar179._28_4_ = auVar9._28_4_ + 0.0;
    local_780 = ZEXT1632(auVar81);
    auVar9 = vsubps_avx(local_780,auVar22);
    auVar182 = vpermps_avx2(_DAT_01fb7720,auVar9);
    auVar12 = vpermps_avx2(_DAT_01fb7720,local_780);
    auVar9 = vmaxps_avx(local_780,auVar179);
    auVar117 = vmaxps_avx(auVar182,auVar12);
    auVar9 = vmaxps_avx(auVar9,auVar117);
    auVar117 = vrsqrtps_avx(ZEXT1632(auVar173));
    fVar128 = auVar117._0_4_;
    fVar143 = auVar117._4_4_;
    fVar148 = auVar117._8_4_;
    fVar144 = auVar117._12_4_;
    fVar145 = auVar117._16_4_;
    fVar146 = auVar117._20_4_;
    fVar147 = auVar117._24_4_;
    auVar224._0_4_ = fVar128 * fVar128 * fVar128 * auVar173._0_4_ * -0.5;
    auVar224._4_4_ = fVar143 * fVar143 * fVar143 * auVar173._4_4_ * -0.5;
    auVar224._8_4_ = fVar148 * fVar148 * fVar148 * auVar173._8_4_ * -0.5;
    auVar224._12_4_ = fVar144 * fVar144 * fVar144 * auVar173._12_4_ * -0.5;
    auVar224._16_4_ = fVar145 * fVar145 * fVar145 * -0.0;
    auVar224._20_4_ = fVar146 * fVar146 * fVar146 * -0.0;
    auVar224._24_4_ = fVar147 * fVar147 * fVar147 * -0.0;
    auVar224._28_4_ = 0;
    auVar167._8_4_ = 0x3fc00000;
    auVar167._0_8_ = 0x3fc000003fc00000;
    auVar167._12_4_ = 0x3fc00000;
    auVar167._16_4_ = 0x3fc00000;
    auVar167._20_4_ = 0x3fc00000;
    auVar167._24_4_ = 0x3fc00000;
    auVar167._28_4_ = 0x3fc00000;
    auVar8 = vfmadd231ps_fma(auVar224,auVar167,auVar117);
    fVar128 = auVar8._0_4_;
    fVar143 = auVar8._4_4_;
    auVar27._4_4_ = fVar231 * fVar143;
    auVar27._0_4_ = fVar230 * fVar128;
    fVar148 = auVar8._8_4_;
    auVar27._8_4_ = fVar232 * fVar148;
    fVar144 = auVar8._12_4_;
    auVar27._12_4_ = fVar233 * fVar144;
    auVar27._16_4_ = fVar234 * 0.0;
    auVar27._20_4_ = fVar235 * 0.0;
    auVar27._24_4_ = fVar247 * 0.0;
    auVar27._28_4_ = auVar117._28_4_;
    auVar28._4_4_ = fStack_5fc * fVar143 * fVar241;
    auVar28._0_4_ = local_600 * fVar128 * fVar236;
    auVar28._8_4_ = fStack_5f8 * fVar148 * fVar242;
    auVar28._12_4_ = fStack_5f4 * fVar144 * fVar243;
    auVar28._16_4_ = fStack_5f0 * fVar244 * 0.0;
    auVar28._20_4_ = fStack_5ec * fVar245 * 0.0;
    auVar28._24_4_ = fStack_5e8 * fVar246 * 0.0;
    auVar28._28_4_ = local_320._28_4_;
    auVar3 = vfmadd231ps_fma(auVar28,auVar27,_local_7a0);
    local_2a0 = ZEXT1632(auVar185);
    local_880 = vsubps_avx(ZEXT832(0) << 0x20,local_2a0);
    fVar147 = local_880._0_4_;
    fVar230 = local_880._4_4_;
    auVar29._4_4_ = fVar230 * fVar143 * fVar241;
    auVar29._0_4_ = fVar147 * fVar128 * fVar236;
    fVar231 = local_880._8_4_;
    auVar29._8_4_ = fVar231 * fVar148 * fVar242;
    fVar232 = local_880._12_4_;
    auVar29._12_4_ = fVar232 * fVar144 * fVar243;
    fVar233 = local_880._16_4_;
    auVar29._16_4_ = fVar233 * fVar244 * 0.0;
    fVar234 = local_880._20_4_;
    auVar29._20_4_ = fVar234 * fVar245 * 0.0;
    fVar235 = local_880._24_4_;
    auVar29._24_4_ = fVar235 * fVar246 * 0.0;
    auVar29._28_4_ = 0x3fc00000;
    local_2c0 = ZEXT1632(auVar80);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,local_2c0);
    auVar173 = vfmadd231ps_fma(auVar29,auVar11,auVar27);
    auVar30._4_4_ = fVar255 * fVar143;
    auVar30._0_4_ = fVar248 * fVar128;
    auVar30._8_4_ = fVar256 * fVar148;
    auVar30._12_4_ = fVar257 * fVar144;
    auVar30._16_4_ = fVar266 * 0.0;
    auVar30._20_4_ = fVar267 * 0.0;
    auVar30._24_4_ = fVar268 * 0.0;
    auVar30._28_4_ = auVar182._28_4_;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar30,_local_5e0);
    auVar115 = ZEXT832(0) << 0x20;
    auVar91 = vsubps_avx(auVar115,auVar114);
    auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar91,auVar30);
    auVar117 = vsqrtps_avx(auVar253);
    auVar31._4_4_ = fVar230 * fStack_5fc;
    auVar31._0_4_ = fVar147 * local_600;
    auVar31._8_4_ = fVar231 * fStack_5f8;
    auVar31._12_4_ = fVar232 * fStack_5f4;
    auVar31._16_4_ = fVar233 * fStack_5f0;
    auVar31._20_4_ = fVar234 * fStack_5ec;
    auVar31._24_4_ = fVar235 * fStack_5e8;
    auVar31._28_4_ = auVar182._28_4_;
    auVar189 = vfmadd231ps_fma(auVar31,_local_7a0,auVar11);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),_local_5e0,auVar91);
    fVar236 = auVar173._0_4_;
    fVar248 = auVar3._0_4_;
    fVar241 = auVar173._4_4_;
    fVar255 = auVar3._4_4_;
    fVar242 = auVar173._8_4_;
    fVar256 = auVar3._8_4_;
    fVar243 = auVar173._12_4_;
    fVar257 = auVar3._12_4_;
    auVar32._28_4_ = auVar253._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar257 * fVar243,
                            CONCAT48(fVar256 * fVar242,CONCAT44(fVar255 * fVar241,fVar248 * fVar236)
                                    )));
    auVar136 = vsubps_avx(ZEXT1632(auVar189),auVar32);
    auVar33._4_4_ = fVar230 * fVar230;
    auVar33._0_4_ = fVar147 * fVar147;
    auVar33._8_4_ = fVar231 * fVar231;
    auVar33._12_4_ = fVar232 * fVar232;
    auVar33._16_4_ = fVar233 * fVar233;
    auVar33._20_4_ = fVar234 * fVar234;
    auVar33._24_4_ = fVar235 * fVar235;
    auVar33._28_4_ = auVar253._28_4_;
    auVar189 = vfmadd231ps_fma(auVar33,auVar11,auVar11);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar91,auVar91);
    auVar170 = vsubps_avx(ZEXT1632(auVar189),
                          ZEXT1632(CONCAT412(fVar243 * fVar243,
                                             CONCAT48(fVar242 * fVar242,
                                                      CONCAT44(fVar241 * fVar241,fVar236 * fVar236))
                                            )));
    fVar247 = auVar117._28_4_ + auVar9._28_4_;
    fVar236 = (auVar117._0_4_ + auVar9._0_4_) * 1.0000002;
    fVar241 = (auVar117._4_4_ + auVar9._4_4_) * 1.0000002;
    fVar242 = (auVar117._8_4_ + auVar9._8_4_) * 1.0000002;
    fVar243 = (auVar117._12_4_ + auVar9._12_4_) * 1.0000002;
    fVar244 = (auVar117._16_4_ + auVar9._16_4_) * 1.0000002;
    fVar245 = (auVar117._20_4_ + auVar9._20_4_) * 1.0000002;
    fVar246 = (auVar117._24_4_ + auVar9._24_4_) * 1.0000002;
    auVar34._4_4_ = fVar241 * fVar241;
    auVar34._0_4_ = fVar236 * fVar236;
    auVar34._8_4_ = fVar242 * fVar242;
    auVar34._12_4_ = fVar243 * fVar243;
    auVar34._16_4_ = fVar244 * fVar244;
    auVar34._20_4_ = fVar245 * fVar245;
    auVar34._24_4_ = fVar246 * fVar246;
    auVar34._28_4_ = fVar247;
    fVar145 = auVar136._0_4_ + auVar136._0_4_;
    fVar146 = auVar136._4_4_ + auVar136._4_4_;
    local_460._0_8_ = CONCAT44(fVar146,fVar145);
    local_460._8_4_ = auVar136._8_4_ + auVar136._8_4_;
    local_460._12_4_ = auVar136._12_4_ + auVar136._12_4_;
    local_460._16_4_ = auVar136._16_4_ + auVar136._16_4_;
    local_460._20_4_ = auVar136._20_4_ + auVar136._20_4_;
    local_460._24_4_ = auVar136._24_4_ + auVar136._24_4_;
    local_460._28_4_ = auVar136._28_4_ + auVar136._28_4_;
    auVar253 = vsubps_avx(auVar170,auVar34);
    local_340 = ZEXT1632(auVar3);
    auVar35._28_4_ = fVar247;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(fVar257 * fVar257,
                            CONCAT48(fVar256 * fVar256,CONCAT44(fVar255 * fVar255,fVar248 * fVar248)
                                    )));
    auVar240 = ZEXT3264(auVar35);
    auVar9 = vsubps_avx(local_260,auVar35);
    auVar36._4_4_ = fVar146 * fVar146;
    auVar36._0_4_ = fVar145 * fVar145;
    auVar36._8_4_ = local_460._8_4_ * local_460._8_4_;
    auVar36._12_4_ = local_460._12_4_ * local_460._12_4_;
    auVar36._16_4_ = local_460._16_4_ * local_460._16_4_;
    auVar36._20_4_ = local_460._20_4_ * local_460._20_4_;
    auVar36._24_4_ = local_460._24_4_ * local_460._24_4_;
    auVar36._28_4_ = auVar117._28_4_;
    fVar236 = auVar9._0_4_;
    fVar241 = auVar9._4_4_;
    fVar242 = auVar9._8_4_;
    fVar243 = auVar9._12_4_;
    fVar244 = auVar9._16_4_;
    fVar245 = auVar9._20_4_;
    fVar246 = auVar9._24_4_;
    auVar37._4_4_ = fVar241 * 4.0 * auVar253._4_4_;
    auVar37._0_4_ = fVar236 * 4.0 * auVar253._0_4_;
    auVar37._8_4_ = fVar242 * 4.0 * auVar253._8_4_;
    auVar37._12_4_ = fVar243 * 4.0 * auVar253._12_4_;
    auVar37._16_4_ = fVar244 * 4.0 * auVar253._16_4_;
    auVar37._20_4_ = fVar245 * 4.0 * auVar253._20_4_;
    auVar37._24_4_ = fVar246 * 4.0 * auVar253._24_4_;
    auVar37._28_4_ = 0x40800000;
    auVar136 = vsubps_avx(auVar36,auVar37);
    local_b60 = vcmpps_avx(auVar136,auVar115,5);
    local_420 = vandps_avx(auVar35,local_6e0);
    local_a80._0_4_ = fVar236 + fVar236;
    local_a80._4_4_ = fVar241 + fVar241;
    local_a80._8_4_ = fVar242 + fVar242;
    local_a80._12_4_ = fVar243 + fVar243;
    local_a80._16_4_ = fVar244 + fVar244;
    local_a80._20_4_ = fVar245 + fVar245;
    local_a80._24_4_ = fVar246 + fVar246;
    local_a80._28_4_ = auVar9._28_4_ + auVar9._28_4_;
    local_440 = vandps_avx(local_6e0,auVar9);
    uStack_890 = 0x80000000;
    uStack_88c = 0x80000000;
    uStack_888 = 0x80000000;
    uStack_884 = 0x80000000;
    local_480 = ZEXT1632(auVar173);
    if ((((((((local_b60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_b60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_b60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_b60 >> 0x7f,0) == '\0') &&
          (local_b60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_b60 >> 0xbf,0) == '\0') &&
        (local_b60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_b60[0x1f]) {
      auVar260._8_4_ = 0x7f800000;
      auVar260._0_8_ = 0x7f8000007f800000;
      auVar260._12_4_ = 0x7f800000;
      auVar260._16_4_ = 0x7f800000;
      auVar260._20_4_ = 0x7f800000;
      auVar260._24_4_ = 0x7f800000;
      auVar260._28_4_ = 0x7f800000;
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
    }
    else {
      auVar194 = vsqrtps_avx(auVar136);
      auVar135 = vrcpps_avx(local_a80);
      auVar9 = vcmpps_avx(auVar136,auVar115,5);
      auVar207._8_4_ = 0x3f800000;
      auVar207._0_8_ = 0x3f8000003f800000;
      auVar207._12_4_ = 0x3f800000;
      auVar207._16_4_ = 0x3f800000;
      auVar207._20_4_ = 0x3f800000;
      auVar207._24_4_ = 0x3f800000;
      auVar207._28_4_ = 0x3f800000;
      auVar3 = vfnmadd213ps_fma(auVar135,local_a80,auVar207);
      auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar135,auVar135);
      auVar263._0_8_ = CONCAT44(fVar146,fVar145) ^ 0x8000000080000000;
      auVar263._8_4_ = -local_460._8_4_;
      auVar263._12_4_ = -local_460._12_4_;
      auVar263._16_4_ = -local_460._16_4_;
      auVar263._20_4_ = -local_460._20_4_;
      auVar263._24_4_ = -local_460._24_4_;
      auVar263._28_4_ = -local_460._28_4_;
      auVar136 = vsubps_avx(auVar263,auVar194);
      auVar38._4_4_ = auVar136._4_4_ * auVar3._4_4_;
      auVar38._0_4_ = auVar136._0_4_ * auVar3._0_4_;
      auVar38._8_4_ = auVar136._8_4_ * auVar3._8_4_;
      auVar38._12_4_ = auVar136._12_4_ * auVar3._12_4_;
      auVar38._16_4_ = auVar136._16_4_ * 0.0;
      auVar38._20_4_ = auVar136._20_4_ * 0.0;
      auVar38._24_4_ = auVar136._24_4_ * 0.0;
      auVar38._28_4_ = auVar136._28_4_;
      auVar136 = vsubps_avx(auVar194,local_460);
      auVar39._4_4_ = auVar3._4_4_ * auVar136._4_4_;
      auVar39._0_4_ = auVar3._0_4_ * auVar136._0_4_;
      auVar39._8_4_ = auVar3._8_4_ * auVar136._8_4_;
      auVar39._12_4_ = auVar3._12_4_ * auVar136._12_4_;
      auVar39._16_4_ = auVar136._16_4_ * 0.0;
      auVar39._20_4_ = auVar136._20_4_ * 0.0;
      auVar39._24_4_ = auVar136._24_4_ * 0.0;
      auVar39._28_4_ = auVar136._28_4_;
      auVar3 = vfmadd213ps_fma(local_340,auVar38,local_480);
      local_400 = fVar128 * auVar3._0_4_;
      fStack_3fc = fVar143 * auVar3._4_4_;
      fStack_3f8 = fVar148 * auVar3._8_4_;
      fStack_3f4 = fVar144 * auVar3._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = 0x3f800000;
      auVar3 = vfmadd213ps_fma(local_340,auVar39,local_480);
      local_3e0 = fVar128 * auVar3._0_4_;
      fStack_3dc = fVar143 * auVar3._4_4_;
      fStack_3d8 = fVar148 * auVar3._8_4_;
      fStack_3d4 = fVar144 * auVar3._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x3f800000;
      auVar208._8_4_ = 0x7f800000;
      auVar208._0_8_ = 0x7f8000007f800000;
      auVar208._12_4_ = 0x7f800000;
      auVar208._16_4_ = 0x7f800000;
      auVar208._20_4_ = 0x7f800000;
      auVar208._24_4_ = 0x7f800000;
      auVar208._28_4_ = 0x7f800000;
      auVar260 = vblendvps_avx(auVar208,auVar38,auVar9);
      auVar209._8_4_ = 0xff800000;
      auVar209._0_8_ = 0xff800000ff800000;
      auVar209._12_4_ = 0xff800000;
      auVar209._16_4_ = 0xff800000;
      auVar209._20_4_ = 0xff800000;
      auVar209._24_4_ = 0xff800000;
      auVar209._28_4_ = 0xff800000;
      auVar250 = vblendvps_avx(auVar209,auVar39,auVar9);
      auVar136 = vmaxps_avx(local_520,local_420);
      auVar40._4_4_ = auVar136._4_4_ * 1.9073486e-06;
      auVar40._0_4_ = auVar136._0_4_ * 1.9073486e-06;
      auVar40._8_4_ = auVar136._8_4_ * 1.9073486e-06;
      auVar40._12_4_ = auVar136._12_4_ * 1.9073486e-06;
      auVar40._16_4_ = auVar136._16_4_ * 1.9073486e-06;
      auVar40._20_4_ = auVar136._20_4_ * 1.9073486e-06;
      auVar40._24_4_ = auVar136._24_4_ * 1.9073486e-06;
      auVar40._28_4_ = auVar136._28_4_;
      auVar136 = vcmpps_avx(local_440,auVar40,1);
      auVar240 = ZEXT3264(auVar136);
      auVar115 = auVar9 & auVar136;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') {
        auVar136 = vandps_avx(auVar136,auVar9);
        auVar115 = vcmpps_avx(auVar253,_DAT_01f7b000,2);
        auVar213._8_4_ = 0xff800000;
        auVar213._0_8_ = 0xff800000ff800000;
        auVar213._12_4_ = 0xff800000;
        auVar213._16_4_ = 0xff800000;
        auVar213._20_4_ = 0xff800000;
        auVar213._24_4_ = 0xff800000;
        auVar213._28_4_ = 0xff800000;
        auVar225._8_4_ = 0x7f800000;
        auVar225._0_8_ = 0x7f8000007f800000;
        auVar225._12_4_ = 0x7f800000;
        auVar225._16_4_ = 0x7f800000;
        auVar225._20_4_ = 0x7f800000;
        auVar225._24_4_ = 0x7f800000;
        auVar225._28_4_ = 0x7f800000;
        auVar253 = vblendvps_avx(auVar225,auVar213,auVar115);
        auVar3 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
        auVar135 = vpmovsxwd_avx2(auVar3);
        auVar240 = ZEXT3264(auVar135);
        auVar260 = vblendvps_avx(auVar260,auVar253,auVar135);
        auVar253 = vblendvps_avx(auVar213,auVar225,auVar115);
        auVar250 = vblendvps_avx(auVar250,auVar253,auVar135);
        auVar202._0_8_ = auVar136._0_8_ ^ 0xffffffffffffffff;
        auVar202._8_4_ = auVar136._8_4_ ^ 0xffffffff;
        auVar202._12_4_ = auVar136._12_4_ ^ 0xffffffff;
        auVar202._16_4_ = auVar136._16_4_ ^ 0xffffffff;
        auVar202._20_4_ = auVar136._20_4_ ^ 0xffffffff;
        auVar202._24_4_ = auVar136._24_4_ ^ 0xffffffff;
        auVar202._28_4_ = auVar136._28_4_ ^ 0xffffffff;
        auVar253 = vorps_avx(auVar115,auVar202);
        local_b60 = vandps_avx(auVar9,auVar253);
      }
    }
    local_8c0 = ZEXT1632(auVar8);
    auVar198 = ZEXT3264(local_b20);
    auVar9 = local_360 & local_b60;
    auVar253 = local_920;
    auVar258 = local_940;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar9 >> 0x7f,0) == '\0') &&
          (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar9 >> 0xbf,0) == '\0') &&
        (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar9[0x1f]) {
      auVar219 = ZEXT3264(local_a60);
      auVar272 = ZEXT3264(local_960);
      auVar214 = ZEXT3264(local_980);
    }
    else {
      fVar145 = (ray->org).field_0.m128[3] - (float)local_820._0_4_;
      auVar196._4_4_ = fVar145;
      auVar196._0_4_ = fVar145;
      auVar196._8_4_ = fVar145;
      auVar196._12_4_ = fVar145;
      auVar196._16_4_ = fVar145;
      auVar196._20_4_ = fVar145;
      auVar196._24_4_ = fVar145;
      auVar196._28_4_ = fVar145;
      auVar136 = vmaxps_avx(auVar196,auVar260);
      fVar145 = ray->tfar - (float)local_820._0_4_;
      auVar200._4_4_ = fVar145;
      auVar200._0_4_ = fVar145;
      auVar200._8_4_ = fVar145;
      auVar200._12_4_ = fVar145;
      auVar200._16_4_ = fVar145;
      auVar200._20_4_ = fVar145;
      auVar200._24_4_ = fVar145;
      auVar200._28_4_ = fVar145;
      auVar115 = vminps_avx(auVar200,auVar250);
      auVar168._0_4_ = fVar101 * fVar147;
      auVar168._4_4_ = fVar122 * fVar230;
      auVar168._8_4_ = fVar123 * fVar231;
      auVar168._12_4_ = fVar124 * fVar232;
      auVar168._16_4_ = fVar125 * fVar233;
      auVar168._20_4_ = fVar126 * fVar234;
      auVar168._24_4_ = fVar127 * fVar235;
      auVar168._28_4_ = 0;
      auVar8 = vfmadd213ps_fma(auVar11,local_a20,auVar168);
      auVar3 = vfmadd213ps_fma(auVar91,local_720,ZEXT1632(auVar8));
      auVar41._4_4_ = fStack_5fc * fVar122;
      auVar41._0_4_ = local_600 * fVar101;
      auVar41._8_4_ = fStack_5f8 * fVar123;
      auVar41._12_4_ = fStack_5f4 * fVar124;
      auVar41._16_4_ = fStack_5f0 * fVar125;
      auVar41._20_4_ = fStack_5ec * fVar126;
      auVar41._24_4_ = fStack_5e8 * fVar127;
      auVar41._28_4_ = auVar10._28_4_;
      auVar8 = vfmadd231ps_fma(auVar41,_local_7a0,local_a20);
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_5e0,local_720);
      auVar9 = vandps_avx(local_6e0,ZEXT1632(auVar173));
      auVar264._8_4_ = 0x219392ef;
      auVar264._0_8_ = 0x219392ef219392ef;
      auVar264._12_4_ = 0x219392ef;
      auVar264._16_4_ = 0x219392ef;
      auVar264._20_4_ = 0x219392ef;
      auVar264._24_4_ = 0x219392ef;
      auVar264._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar9,auVar264,1);
      auVar9 = vrcpps_avx(ZEXT1632(auVar173));
      auVar251._8_4_ = 0x3f800000;
      auVar251._0_8_ = 0x3f8000003f800000;
      auVar251._12_4_ = 0x3f800000;
      auVar251._16_4_ = 0x3f800000;
      auVar251._20_4_ = 0x3f800000;
      auVar251._24_4_ = 0x3f800000;
      auVar251._28_4_ = 0x3f800000;
      auVar91 = ZEXT1632(auVar173);
      auVar8 = vfnmadd213ps_fma(auVar9,auVar91,auVar251);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar9,auVar9);
      auVar237._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
      auVar237._8_4_ = auVar173._8_4_ ^ 0x80000000;
      auVar237._12_4_ = auVar173._12_4_ ^ 0x80000000;
      auVar237._16_4_ = 0x80000000;
      auVar237._20_4_ = 0x80000000;
      auVar237._24_4_ = 0x80000000;
      auVar237._28_4_ = 0x80000000;
      auVar42._4_4_ = auVar8._4_4_ * -auVar3._4_4_;
      auVar42._0_4_ = auVar8._0_4_ * -auVar3._0_4_;
      auVar42._8_4_ = auVar8._8_4_ * -auVar3._8_4_;
      auVar42._12_4_ = auVar8._12_4_ * -auVar3._12_4_;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar9 = vcmpps_avx(auVar91,auVar237,1);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar265._8_4_ = 0xff800000;
      auVar265._0_8_ = 0xff800000ff800000;
      auVar265._12_4_ = 0xff800000;
      auVar265._16_4_ = 0xff800000;
      auVar265._20_4_ = 0xff800000;
      auVar265._24_4_ = 0xff800000;
      auVar265._28_4_ = 0xff800000;
      auVar9 = vblendvps_avx(auVar42,auVar265,auVar9);
      auVar11 = vmaxps_avx(auVar136,auVar9);
      auVar9 = vcmpps_avx(auVar91,auVar237,6);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar238._8_4_ = 0x7f800000;
      auVar238._0_8_ = 0x7f8000007f800000;
      auVar238._12_4_ = 0x7f800000;
      auVar238._16_4_ = 0x7f800000;
      auVar238._20_4_ = 0x7f800000;
      auVar238._24_4_ = 0x7f800000;
      auVar238._28_4_ = 0x7f800000;
      auVar240 = ZEXT3264(auVar238);
      auVar9 = vblendvps_avx(auVar42,auVar238,auVar9);
      auVar91 = vminps_avx(auVar115,auVar9);
      fVar101 = -local_a40._0_4_;
      fVar145 = -local_a40._4_4_;
      fVar122 = -local_a40._8_4_;
      fVar146 = -local_a40._12_4_;
      fVar123 = -local_a40._16_4_;
      fVar124 = -local_a40._20_4_;
      fVar125 = -local_a40._24_4_;
      auVar169._0_8_ = local_9a0._0_8_ ^ 0x8000000080000000;
      auVar169._8_4_ = -local_9a0._8_4_;
      auVar169._12_4_ = -local_9a0._12_4_;
      auVar169._16_4_ = -local_9a0._16_4_;
      auVar169._20_4_ = -local_9a0._20_4_;
      auVar169._24_4_ = -local_9a0._24_4_;
      auVar169._28_4_ = local_9a0._28_4_ ^ 0x80000000;
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,_local_860);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_a00);
      auVar43._4_4_ = auVar10._4_4_ * fVar145;
      auVar43._0_4_ = auVar10._0_4_ * fVar101;
      auVar43._8_4_ = auVar10._8_4_ * fVar122;
      auVar43._12_4_ = auVar10._12_4_ * fVar146;
      auVar43._16_4_ = auVar10._16_4_ * fVar123;
      auVar43._20_4_ = auVar10._20_4_ * fVar124;
      auVar43._24_4_ = auVar10._24_4_ * fVar125;
      auVar43._28_4_ = auVar10._28_4_;
      auVar8 = vfmadd231ps_fma(auVar43,auVar169,auVar9);
      auVar180._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
      auVar180._8_4_ = -local_900._8_4_;
      auVar180._12_4_ = -local_900._12_4_;
      auVar180._16_4_ = -local_900._16_4_;
      auVar180._20_4_ = -local_900._20_4_;
      auVar180._24_4_ = -local_900._24_4_;
      auVar180._28_4_ = local_900._28_4_ ^ 0x80000000;
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_840);
      auVar3 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar180,auVar9);
      auVar44._4_4_ = fStack_5fc * fVar145;
      auVar44._0_4_ = local_600 * fVar101;
      auVar44._8_4_ = fStack_5f8 * fVar122;
      auVar44._12_4_ = fStack_5f4 * fVar146;
      auVar44._16_4_ = fStack_5f0 * fVar123;
      auVar44._20_4_ = fStack_5ec * fVar124;
      auVar44._24_4_ = fStack_5e8 * fVar125;
      auVar44._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar8 = vfmadd231ps_fma(auVar44,auVar169,_local_7a0);
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_5e0,auVar180);
      auVar9 = vandps_avx(local_6e0,ZEXT1632(auVar173));
      auVar136 = vrcpps_avx(ZEXT1632(auVar173));
      auVar201._8_4_ = 0x219392ef;
      auVar201._0_8_ = 0x219392ef219392ef;
      auVar201._12_4_ = 0x219392ef;
      auVar201._16_4_ = 0x219392ef;
      auVar201._20_4_ = 0x219392ef;
      auVar201._24_4_ = 0x219392ef;
      auVar201._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar9,auVar201,1);
      auVar115 = ZEXT1632(auVar173);
      auVar8 = vfnmadd213ps_fma(auVar136,auVar115,auVar251);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar136,auVar136);
      auVar181._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = auVar173._8_4_ ^ 0x80000000;
      auVar181._12_4_ = auVar173._12_4_ ^ 0x80000000;
      auVar181._16_4_ = 0x80000000;
      auVar181._20_4_ = 0x80000000;
      auVar181._24_4_ = 0x80000000;
      auVar181._28_4_ = 0x80000000;
      auVar45._4_4_ = auVar8._4_4_ * -auVar3._4_4_;
      auVar45._0_4_ = auVar8._0_4_ * -auVar3._0_4_;
      auVar45._8_4_ = auVar8._8_4_ * -auVar3._8_4_;
      auVar45._12_4_ = auVar8._12_4_ * -auVar3._12_4_;
      auVar45._16_4_ = 0x80000000;
      auVar45._20_4_ = 0x80000000;
      auVar45._24_4_ = 0x80000000;
      auVar45._28_4_ = 0x80000000;
      auVar9 = vcmpps_avx(auVar115,auVar181,1);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar9 = vblendvps_avx(auVar45,auVar265,auVar9);
      local_700 = vmaxps_avx(auVar11,auVar9);
      auVar9 = vcmpps_avx(auVar115,auVar181,6);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar10 = vblendvps_avx(auVar45,auVar238,auVar9);
      auVar9 = vandps_avx(local_b60,local_360);
      local_580 = vminps_avx(auVar91,auVar10);
      auVar10 = vcmpps_avx(local_700,local_580,2);
      auVar11 = auVar9 & auVar10;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar64._4_4_ = fStack_3fc;
        auVar64._0_4_ = local_400;
        auVar64._8_4_ = fStack_3f8;
        auVar64._12_4_ = fStack_3f4;
        auVar64._16_4_ = uStack_3f0;
        auVar64._20_4_ = uStack_3ec;
        auVar64._24_4_ = uStack_3e8;
        auVar64._28_4_ = uStack_3e4;
        auVar11 = vminps_avx(auVar64,auVar251);
        auVar136 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar11 = vmaxps_avx(auVar11,ZEXT832(0) << 0x20);
        auVar65._4_4_ = fStack_3dc;
        auVar65._0_4_ = local_3e0;
        auVar65._8_4_ = fStack_3d8;
        auVar65._12_4_ = fStack_3d4;
        auVar65._16_4_ = uStack_3d0;
        auVar65._20_4_ = uStack_3cc;
        auVar65._24_4_ = uStack_3c8;
        auVar65._28_4_ = uStack_3c4;
        auVar91 = vminps_avx(auVar65,auVar251);
        auVar91 = vmaxps_avx(auVar91,ZEXT832(0) << 0x20);
        auVar46._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar11._28_4_ + 7.0;
        auVar8 = vfmadd213ps_fma(auVar46,local_760,local_740);
        auVar47._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar91._28_4_ + 7.0;
        auVar3 = vfmadd213ps_fma(auVar47,local_760,local_740);
        auVar11 = vminps_avx(local_780,auVar179);
        auVar91 = vminps_avx(auVar182,auVar12);
        auVar11 = vminps_avx(auVar11,auVar91);
        auVar117 = vsubps_avx(auVar11,auVar117);
        auVar9 = vandps_avx(auVar10,auVar9);
        local_1a0 = ZEXT1632(auVar8);
        local_1c0 = ZEXT1632(auVar3);
        auVar48._4_4_ = auVar117._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar117._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar117._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar117._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar117._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar117._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar117._24_4_ * 0.99999976;
        auVar48._28_4_ = 0x3f7ffffc;
        auVar117 = vmaxps_avx(ZEXT832(0) << 0x20,auVar48);
        auVar49._4_4_ = auVar117._4_4_ * auVar117._4_4_;
        auVar49._0_4_ = auVar117._0_4_ * auVar117._0_4_;
        auVar49._8_4_ = auVar117._8_4_ * auVar117._8_4_;
        auVar49._12_4_ = auVar117._12_4_ * auVar117._12_4_;
        auVar49._16_4_ = auVar117._16_4_ * auVar117._16_4_;
        auVar49._20_4_ = auVar117._20_4_ * auVar117._20_4_;
        auVar49._24_4_ = auVar117._24_4_ * auVar117._24_4_;
        auVar49._28_4_ = auVar117._28_4_;
        auVar10 = vsubps_avx(auVar170,auVar49);
        auVar50._4_4_ = auVar10._4_4_ * fVar241 * 4.0;
        auVar50._0_4_ = auVar10._0_4_ * fVar236 * 4.0;
        auVar50._8_4_ = auVar10._8_4_ * fVar242 * 4.0;
        auVar50._12_4_ = auVar10._12_4_ * fVar243 * 4.0;
        auVar50._16_4_ = auVar10._16_4_ * fVar244 * 4.0;
        auVar50._20_4_ = auVar10._20_4_ * fVar245 * 4.0;
        auVar50._24_4_ = auVar10._24_4_ * fVar246 * 4.0;
        auVar50._28_4_ = auVar117._28_4_;
        auVar11 = vsubps_avx(auVar36,auVar50);
        auVar117 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) {
          auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar193 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar170 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar182 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar222 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar210._8_4_ = 0x7f800000;
          auVar210._0_8_ = 0x7f8000007f800000;
          auVar210._12_4_ = 0x7f800000;
          auVar210._16_4_ = 0x7f800000;
          auVar210._20_4_ = 0x7f800000;
          auVar210._24_4_ = 0x7f800000;
          auVar210._28_4_ = 0x7f800000;
          auVar228._8_4_ = 0xff800000;
          auVar228._0_8_ = 0xff800000ff800000;
          auVar228._12_4_ = 0xff800000;
          auVar228._16_4_ = 0xff800000;
          auVar228._20_4_ = 0xff800000;
          auVar228._24_4_ = 0xff800000;
          auVar228._28_4_ = 0xff800000;
          local_b60 = auVar117;
        }
        else {
          auVar136 = vrcpps_avx(local_a80);
          auVar8 = vfnmadd213ps_fma(local_a80,auVar136,auVar251);
          auVar170 = vsqrtps_avx(auVar11);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar136,auVar136);
          auVar137._0_8_ = local_460._0_8_ ^ 0x8000000080000000;
          auVar137._8_4_ = -local_460._8_4_;
          auVar137._12_4_ = -local_460._12_4_;
          auVar137._16_4_ = -local_460._16_4_;
          auVar137._20_4_ = -local_460._20_4_;
          auVar137._24_4_ = -local_460._24_4_;
          auVar137._28_4_ = -local_460._28_4_;
          auVar136 = vsubps_avx(auVar137,auVar170);
          auVar170 = vsubps_avx(auVar170,local_460);
          fVar101 = auVar136._0_4_ * auVar8._0_4_;
          fVar145 = auVar136._4_4_ * auVar8._4_4_;
          auVar51._4_4_ = fVar145;
          auVar51._0_4_ = fVar101;
          fVar122 = auVar136._8_4_ * auVar8._8_4_;
          auVar51._8_4_ = fVar122;
          fVar146 = auVar136._12_4_ * auVar8._12_4_;
          auVar51._12_4_ = fVar146;
          fVar123 = auVar136._16_4_ * 0.0;
          auVar51._16_4_ = fVar123;
          fVar124 = auVar136._20_4_ * 0.0;
          auVar51._20_4_ = fVar124;
          fVar125 = auVar136._24_4_ * 0.0;
          auVar51._24_4_ = fVar125;
          auVar51._28_4_ = local_b60._28_4_;
          fVar236 = auVar170._0_4_ * auVar8._0_4_;
          fVar241 = auVar170._4_4_ * auVar8._4_4_;
          auVar52._4_4_ = fVar241;
          auVar52._0_4_ = fVar236;
          fVar242 = auVar170._8_4_ * auVar8._8_4_;
          auVar52._8_4_ = fVar242;
          fVar243 = auVar170._12_4_ * auVar8._12_4_;
          auVar52._12_4_ = fVar243;
          fVar244 = auVar170._16_4_ * 0.0;
          auVar52._16_4_ = fVar244;
          fVar245 = auVar170._20_4_ * 0.0;
          auVar52._20_4_ = fVar245;
          fVar246 = auVar170._24_4_ * 0.0;
          auVar52._24_4_ = fVar246;
          auVar52._28_4_ = auVar91._28_4_;
          auVar8 = vfmadd213ps_fma(local_340,auVar51,local_480);
          auVar3 = vfmadd213ps_fma(local_340,auVar52,local_480);
          auVar91 = ZEXT1632(CONCAT412(fVar144 * auVar8._12_4_,
                                       CONCAT48(fVar148 * auVar8._8_4_,
                                                CONCAT44(fVar143 * auVar8._4_4_,
                                                         fVar128 * auVar8._0_4_))));
          auVar136 = ZEXT1632(CONCAT412(fVar144 * auVar3._12_4_,
                                        CONCAT48(fVar148 * auVar3._8_4_,
                                                 CONCAT44(fVar143 * auVar3._4_4_,
                                                          fVar128 * auVar3._0_4_))));
          auVar8 = vfmadd213ps_fma(local_300,auVar91,auVar114);
          auVar3 = vfmadd213ps_fma(local_300,auVar136,auVar114);
          auVar173 = vfmadd213ps_fma(local_320,auVar91,local_2c0);
          auVar189 = vfmadd213ps_fma(local_320,auVar136,local_2c0);
          auVar84 = vfmadd213ps_fma(auVar91,local_2e0,local_2a0);
          auVar220 = vfmadd213ps_fma(local_2e0,auVar136,local_2a0);
          auVar53._4_4_ = fVar145 * (float)local_5e0._4_4_;
          auVar53._0_4_ = fVar101 * (float)local_5e0._0_4_;
          auVar53._8_4_ = fVar122 * fStack_5d8;
          auVar53._12_4_ = fVar146 * fStack_5d4;
          auVar53._16_4_ = fVar123 * fStack_5d0;
          auVar53._20_4_ = fVar124 * fStack_5cc;
          auVar53._24_4_ = fVar125 * fStack_5c8;
          auVar53._28_4_ = 0;
          auVar170 = vsubps_avx(auVar53,ZEXT1632(auVar8));
          auVar183._0_4_ = fVar101 * (float)local_7a0._0_4_;
          auVar183._4_4_ = fVar145 * (float)local_7a0._4_4_;
          auVar183._8_4_ = fVar122 * fStack_798;
          auVar183._12_4_ = fVar146 * fStack_794;
          auVar183._16_4_ = fVar123 * fStack_790;
          auVar183._20_4_ = fVar124 * fStack_78c;
          auVar183._24_4_ = fVar125 * fStack_788;
          auVar183._28_4_ = 0;
          auVar182 = vsubps_avx(auVar183,ZEXT1632(auVar173));
          auVar197._0_4_ = local_600 * fVar101;
          auVar197._4_4_ = fStack_5fc * fVar145;
          auVar197._8_4_ = fStack_5f8 * fVar122;
          auVar197._12_4_ = fStack_5f4 * fVar146;
          auVar197._16_4_ = fStack_5f0 * fVar123;
          auVar197._20_4_ = fStack_5ec * fVar124;
          auVar197._24_4_ = fStack_5e8 * fVar125;
          auVar197._28_4_ = 0;
          auVar12 = vsubps_avx(auVar197,ZEXT1632(auVar84));
          auVar54._4_4_ = fVar241 * (float)local_5e0._4_4_;
          auVar54._0_4_ = fVar236 * (float)local_5e0._0_4_;
          auVar54._8_4_ = fVar242 * fStack_5d8;
          auVar54._12_4_ = fVar243 * fStack_5d4;
          auVar54._16_4_ = fVar244 * fStack_5d0;
          auVar54._20_4_ = fVar245 * fStack_5cc;
          auVar54._24_4_ = fVar246 * fStack_5c8;
          auVar54._28_4_ = auVar12._28_4_;
          auVar136 = vsubps_avx(auVar54,ZEXT1632(auVar3));
          auVar55._4_4_ = fVar241 * (float)local_7a0._4_4_;
          auVar55._0_4_ = fVar236 * (float)local_7a0._0_4_;
          auVar55._8_4_ = fVar242 * fStack_798;
          auVar55._12_4_ = fVar243 * fStack_794;
          auVar55._16_4_ = fVar244 * fStack_790;
          auVar55._20_4_ = fVar245 * fStack_78c;
          auVar55._24_4_ = fVar246 * fStack_788;
          auVar55._28_4_ = 0;
          auVar114 = vsubps_avx(auVar55,ZEXT1632(auVar189));
          auVar56._4_4_ = fStack_5fc * fVar241;
          auVar56._0_4_ = local_600 * fVar236;
          auVar56._8_4_ = fStack_5f8 * fVar242;
          auVar56._12_4_ = fStack_5f4 * fVar243;
          auVar56._16_4_ = fStack_5f0 * fVar244;
          auVar56._20_4_ = fStack_5ec * fVar245;
          auVar56._24_4_ = fStack_5e8 * fVar246;
          auVar56._28_4_ = 0;
          auVar91 = vsubps_avx(auVar56,ZEXT1632(auVar220));
          auVar193 = auVar91._0_28_;
          auVar11 = vcmpps_avx(auVar11,_DAT_01f7b000,5);
          auVar211._8_4_ = 0x7f800000;
          auVar211._0_8_ = 0x7f8000007f800000;
          auVar211._12_4_ = 0x7f800000;
          auVar211._16_4_ = 0x7f800000;
          auVar211._20_4_ = 0x7f800000;
          auVar211._24_4_ = 0x7f800000;
          auVar211._28_4_ = 0x7f800000;
          auVar210 = vblendvps_avx(auVar211,auVar51,auVar11);
          auVar91 = vmaxps_avx(local_520,local_420);
          auVar57._4_4_ = auVar91._4_4_ * 1.9073486e-06;
          auVar57._0_4_ = auVar91._0_4_ * 1.9073486e-06;
          auVar57._8_4_ = auVar91._8_4_ * 1.9073486e-06;
          auVar57._12_4_ = auVar91._12_4_ * 1.9073486e-06;
          auVar57._16_4_ = auVar91._16_4_ * 1.9073486e-06;
          auVar57._20_4_ = auVar91._20_4_ * 1.9073486e-06;
          auVar57._24_4_ = auVar91._24_4_ * 1.9073486e-06;
          auVar57._28_4_ = auVar91._28_4_;
          auVar91 = vcmpps_avx(local_440,auVar57,1);
          auVar229._8_4_ = 0xff800000;
          auVar229._0_8_ = 0xff800000ff800000;
          auVar229._12_4_ = 0xff800000;
          auVar229._16_4_ = 0xff800000;
          auVar229._20_4_ = 0xff800000;
          auVar229._24_4_ = 0xff800000;
          auVar229._28_4_ = 0xff800000;
          auVar228 = vblendvps_avx(auVar229,auVar52,auVar11);
          auVar115 = auVar11 & auVar91;
          local_b60 = auVar117;
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar115 >> 0x7f,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0xbf,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar115[0x1f] < '\0') {
            auVar117 = vandps_avx(auVar91,auVar11);
            auVar91 = vcmpps_avx(auVar10,_DAT_01f7b000,2);
            auVar226._8_4_ = 0xff800000;
            auVar226._0_8_ = 0xff800000ff800000;
            auVar226._12_4_ = 0xff800000;
            auVar226._16_4_ = 0xff800000;
            auVar226._20_4_ = 0xff800000;
            auVar226._24_4_ = 0xff800000;
            auVar226._28_4_ = 0xff800000;
            auVar271._8_4_ = 0x7f800000;
            auVar271._0_8_ = 0x7f8000007f800000;
            auVar271._12_4_ = 0x7f800000;
            auVar271._16_4_ = 0x7f800000;
            auVar271._20_4_ = 0x7f800000;
            auVar271._24_4_ = 0x7f800000;
            auVar271._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar271,auVar226,auVar91);
            auVar8 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
            auVar115 = vpmovsxwd_avx2(auVar8);
            auVar210 = vblendvps_avx(auVar210,auVar10,auVar115);
            auVar10 = vblendvps_avx(auVar226,auVar271,auVar91);
            auVar228 = vblendvps_avx(auVar228,auVar10,auVar115);
            auVar218._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
            auVar218._8_4_ = auVar117._8_4_ ^ 0xffffffff;
            auVar218._12_4_ = auVar117._12_4_ ^ 0xffffffff;
            auVar218._16_4_ = auVar117._16_4_ ^ 0xffffffff;
            auVar218._20_4_ = auVar117._20_4_ ^ 0xffffffff;
            auVar218._24_4_ = auVar117._24_4_ ^ 0xffffffff;
            auVar218._28_4_ = auVar117._28_4_ ^ 0xffffffff;
            auVar117 = vorps_avx(auVar91,auVar218);
            local_b60 = vandps_avx(auVar11,auVar117);
          }
          auVar222 = auVar12._0_28_;
        }
        uVar75 = *(undefined4 *)&(ray->dir).field_0;
        auVar239._4_4_ = uVar75;
        auVar239._0_4_ = uVar75;
        auVar239._8_4_ = uVar75;
        auVar239._12_4_ = uVar75;
        auVar239._16_4_ = uVar75;
        auVar239._20_4_ = uVar75;
        auVar239._24_4_ = uVar75;
        auVar239._28_4_ = uVar75;
        auVar240 = ZEXT3264(auVar239);
        uVar75 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar252._4_4_ = uVar75;
        auVar252._0_4_ = uVar75;
        auVar252._8_4_ = uVar75;
        auVar252._12_4_ = uVar75;
        auVar252._16_4_ = uVar75;
        auVar252._20_4_ = uVar75;
        auVar252._24_4_ = uVar75;
        auVar252._28_4_ = uVar75;
        fVar236 = (ray->dir).field_0.m128[2];
        local_560 = local_700;
        local_540 = vminps_avx(local_580,auVar210);
        _local_7c0 = vmaxps_avx(local_700,auVar228);
        _local_5a0 = _local_7c0;
        auVar117 = vcmpps_avx(local_700,local_540,2);
        local_620 = vandps_avx(auVar117,auVar9);
        auVar117 = vcmpps_avx(_local_7c0,local_580,2);
        local_800 = vandps_avx(auVar117,auVar9);
        auVar9 = vorps_avx(local_800,local_620);
        if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0x7f,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0xbf,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          auVar58._4_4_ = fVar236 * auVar193._4_4_;
          auVar58._0_4_ = fVar236 * auVar193._0_4_;
          auVar58._8_4_ = fVar236 * auVar193._8_4_;
          auVar58._12_4_ = fVar236 * auVar193._12_4_;
          auVar58._16_4_ = fVar236 * auVar193._16_4_;
          auVar58._20_4_ = fVar236 * auVar193._20_4_;
          auVar58._24_4_ = fVar236 * auVar193._24_4_;
          auVar58._28_4_ = auVar9._28_4_;
          auVar8 = vfmadd213ps_fma(auVar114,auVar252,auVar58);
          auVar59._4_4_ = auVar222._4_4_ * fVar236;
          auVar59._0_4_ = auVar222._0_4_ * fVar236;
          auVar59._8_4_ = auVar222._8_4_ * fVar236;
          auVar59._12_4_ = auVar222._12_4_ * fVar236;
          auVar59._16_4_ = auVar222._16_4_ * fVar236;
          auVar59._20_4_ = auVar222._20_4_ * fVar236;
          auVar59._24_4_ = auVar222._24_4_ * fVar236;
          auVar59._28_4_ = auVar9._28_4_;
          auVar3 = vfmadd213ps_fma(auVar182,auVar252,auVar59);
          auVar8 = vfmadd213ps_fma(auVar136,auVar239,ZEXT1632(auVar8));
          auVar95._0_8_ = local_b60._0_8_ ^ 0xffffffffffffffff;
          auVar95._8_4_ = local_b60._8_4_ ^ 0xffffffff;
          auVar95._12_4_ = local_b60._12_4_ ^ 0xffffffff;
          auVar95._16_4_ = local_b60._16_4_ ^ 0xffffffff;
          auVar95._20_4_ = local_b60._20_4_ ^ 0xffffffff;
          auVar95._24_4_ = local_b60._24_4_ ^ 0xffffffff;
          auVar95._28_4_ = local_b60._28_4_ ^ 0xffffffff;
          auVar253 = vandps_avx(ZEXT1632(auVar8),local_6e0);
          auVar138._8_4_ = 0x3e99999a;
          auVar138._0_8_ = 0x3e99999a3e99999a;
          auVar138._12_4_ = 0x3e99999a;
          auVar138._16_4_ = 0x3e99999a;
          auVar138._20_4_ = 0x3e99999a;
          auVar138._24_4_ = 0x3e99999a;
          auVar138._28_4_ = 0x3e99999a;
          auVar253 = vcmpps_avx(auVar253,auVar138,1);
          local_660 = vorps_avx(auVar253,auVar95);
          auVar8 = vfmadd213ps_fma(auVar170,auVar239,ZEXT1632(auVar3));
          auVar253 = vandps_avx(ZEXT1632(auVar8),local_6e0);
          auVar253 = vcmpps_avx(auVar253,auVar138,1);
          auVar253 = vorps_avx(auVar253,auVar95);
          auVar119._8_4_ = 3;
          auVar119._0_8_ = 0x300000003;
          auVar119._12_4_ = 3;
          auVar119._16_4_ = 3;
          auVar119._20_4_ = 3;
          auVar119._24_4_ = 3;
          auVar119._28_4_ = 3;
          auVar139._8_4_ = 2;
          auVar139._0_8_ = 0x200000002;
          auVar139._12_4_ = 2;
          auVar139._16_4_ = 2;
          auVar139._20_4_ = 2;
          auVar139._24_4_ = 2;
          auVar139._28_4_ = 2;
          auVar253 = vblendvps_avx(auVar139,auVar119,auVar253);
          local_680._4_4_ = local_b84;
          local_680._0_4_ = local_b84;
          local_680._8_4_ = local_b84;
          local_680._12_4_ = local_b84;
          local_680._16_4_ = local_b84;
          local_680._20_4_ = local_b84;
          local_680._24_4_ = local_b84;
          local_680._28_4_ = local_b84;
          local_640 = vpcmpgtd_avx2(auVar253,local_680);
          auVar253 = vpandn_avx2(local_640,local_620);
          local_7e0._4_4_ = local_700._4_4_ + (float)local_6c0._4_4_;
          local_7e0._0_4_ = local_700._0_4_ + (float)local_6c0._0_4_;
          fStack_7d8 = local_700._8_4_ + fStack_6b8;
          fStack_7d4 = local_700._12_4_ + fStack_6b4;
          fStack_7d0 = local_700._16_4_ + fStack_6b0;
          fStack_7cc = local_700._20_4_ + fStack_6ac;
          fStack_7c8 = local_700._24_4_ + fStack_6a8;
          fStack_7c4 = local_700._28_4_ + fStack_6a4;
          while( true ) {
            local_4a0 = auVar253;
            if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar253 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar253 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar253 >> 0x7f,0) == '\0') &&
                  (auVar253 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar253 >> 0xbf,0) == '\0') &&
                (auVar253 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar253[0x1f]) break;
            auVar120._8_4_ = 0x7f800000;
            auVar120._0_8_ = 0x7f8000007f800000;
            auVar120._12_4_ = 0x7f800000;
            auVar120._16_4_ = 0x7f800000;
            auVar120._20_4_ = 0x7f800000;
            auVar120._24_4_ = 0x7f800000;
            auVar120._28_4_ = 0x7f800000;
            auVar9 = vblendvps_avx(auVar120,local_700,auVar253);
            auVar117 = vshufps_avx(auVar9,auVar9,0xb1);
            auVar117 = vminps_avx(auVar9,auVar117);
            auVar10 = vshufpd_avx(auVar117,auVar117,5);
            auVar117 = vminps_avx(auVar117,auVar10);
            auVar10 = vpermpd_avx2(auVar117,0x4e);
            auVar117 = vminps_avx(auVar117,auVar10);
            auVar9 = vcmpps_avx(auVar9,auVar117,0);
            auVar117 = auVar253 & auVar9;
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0x7f,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0xbf,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar117[0x1f] < '\0') {
              auVar253 = vandps_avx(auVar9,auVar253);
            }
            uVar69 = vmovmskps_avx(auVar253);
            iVar13 = 0;
            for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar74 = (ulong)(uint)(iVar13 << 2);
            *(undefined4 *)(local_4a0 + uVar74) = 0;
            local_8a0 = (ray->dir).field_0;
            auVar8 = vdpps_avx((undefined1  [16])local_8a0,(undefined1  [16])local_8a0,0x7f);
            uVar69 = *(uint *)(local_1a0 + uVar74);
            uVar73 = *(uint *)(local_560 + uVar74);
            if (auVar8._0_4_ < 0.0) {
              auVar240 = ZEXT1664(auVar240._0_16_);
              fVar236 = sqrtf(auVar8._0_4_);
              uVar74 = extraout_RAX;
            }
            else {
              auVar8 = vsqrtss_avx(auVar8,auVar8);
              fVar236 = auVar8._0_4_;
            }
            auVar3 = vminps_avx(local_ac0,local_ae0);
            auVar8 = vmaxps_avx(local_ac0,local_ae0);
            auVar173 = vminps_avx(local_ad0,_local_af0);
            auVar189 = vminps_avx(auVar3,auVar173);
            auVar3 = vmaxps_avx(local_ad0,_local_af0);
            auVar173 = vmaxps_avx(auVar8,auVar3);
            local_8e0._8_4_ = 0x7fffffff;
            local_8e0._0_8_ = 0x7fffffff7fffffff;
            local_8e0._12_4_ = 0x7fffffff;
            auVar8 = vandps_avx(auVar189,local_8e0._0_16_);
            auVar3 = vandps_avx(auVar173,local_8e0._0_16_);
            auVar8 = vmaxps_avx(auVar8,auVar3);
            auVar3 = vmovshdup_avx(auVar8);
            auVar3 = vmaxss_avx(auVar3,auVar8);
            auVar8 = vshufpd_avx(auVar8,auVar8,1);
            auVar8 = vmaxss_avx(auVar8,auVar3);
            local_840._0_4_ = auVar8._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar236 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar173,auVar173,0xff);
            auVar8 = vinsertps_avx(ZEXT416(uVar73),ZEXT416(uVar69),0x10);
            uVar77 = 0;
            while( true ) {
              bVar68 = (byte)uVar74;
              if (uVar77 == 5) break;
              local_a00._0_16_ = vmovshdup_avx(auVar8);
              fVar242 = 1.0 - local_a00._0_4_;
              auVar3 = vshufps_avx(auVar8,auVar8,0x55);
              fVar236 = auVar3._0_4_;
              auVar102._0_4_ = local_ae0._0_4_ * fVar236;
              fVar128 = auVar3._4_4_;
              auVar102._4_4_ = local_ae0._4_4_ * fVar128;
              fVar241 = auVar3._8_4_;
              auVar102._8_4_ = local_ae0._8_4_ * fVar241;
              fVar143 = auVar3._12_4_;
              auVar102._12_4_ = local_ae0._12_4_ * fVar143;
              auVar129._4_4_ = fVar242;
              auVar129._0_4_ = fVar242;
              auVar129._8_4_ = fVar242;
              auVar129._12_4_ = fVar242;
              auVar3 = vfmadd231ps_fma(auVar102,auVar129,local_ac0);
              auVar149._0_4_ = local_ad0._0_4_ * fVar236;
              auVar149._4_4_ = local_ad0._4_4_ * fVar128;
              auVar149._8_4_ = local_ad0._8_4_ * fVar241;
              auVar149._12_4_ = local_ad0._12_4_ * fVar143;
              auVar173 = vfmadd231ps_fma(auVar149,auVar129,local_ae0);
              auVar188._0_4_ = fVar236 * auVar173._0_4_;
              auVar188._4_4_ = fVar128 * auVar173._4_4_;
              auVar188._8_4_ = fVar241 * auVar173._8_4_;
              auVar188._12_4_ = fVar143 * auVar173._12_4_;
              auVar189 = vfmadd231ps_fma(auVar188,auVar129,auVar3);
              auVar103._0_4_ = fVar236 * (float)local_af0._0_4_;
              auVar103._4_4_ = fVar128 * (float)local_af0._4_4_;
              auVar103._8_4_ = fVar241 * fStack_ae8;
              auVar103._12_4_ = fVar143 * fStack_ae4;
              auVar3 = vfmadd231ps_fma(auVar103,auVar129,local_ad0);
              auVar172._0_4_ = fVar236 * auVar3._0_4_;
              auVar172._4_4_ = fVar128 * auVar3._4_4_;
              auVar172._8_4_ = fVar241 * auVar3._8_4_;
              auVar172._12_4_ = fVar143 * auVar3._12_4_;
              auVar173 = vfmadd231ps_fma(auVar172,auVar129,auVar173);
              fVar148 = auVar8._0_4_;
              auVar104._4_4_ = fVar148;
              auVar104._0_4_ = fVar148;
              auVar104._8_4_ = fVar148;
              auVar104._12_4_ = fVar148;
              auVar3 = vfmadd213ps_fma(auVar104,(undefined1  [16])local_8a0,_DAT_01f45a50);
              auVar83._0_4_ = fVar236 * auVar173._0_4_;
              auVar83._4_4_ = fVar128 * auVar173._4_4_;
              auVar83._8_4_ = fVar241 * auVar173._8_4_;
              auVar83._12_4_ = fVar143 * auVar173._12_4_;
              auVar84 = vfmadd231ps_fma(auVar83,auVar189,auVar129);
              local_720._0_16_ = auVar84;
              auVar3 = vsubps_avx(auVar3,auVar84);
              _local_860 = auVar3;
              auVar3 = vdpps_avx(auVar3,auVar3,0x7f);
              fVar236 = auVar3._0_4_;
              if (fVar236 < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar242);
                local_a40._0_16_ = auVar189;
                local_9a0._0_16_ = auVar173;
                auVar100._0_4_ = sqrtf(fVar236);
                auVar100._4_60_ = extraout_var;
                auVar84 = auVar100._0_16_;
                uVar74 = extraout_RAX_00;
                auVar173 = local_9a0._0_16_;
                auVar189 = local_a40._0_16_;
                auVar220 = local_a20._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar3,auVar3);
                auVar220 = ZEXT416((uint)fVar242);
              }
              auVar173 = vsubps_avx(auVar173,auVar189);
              auVar203._0_4_ = auVar173._0_4_ * 3.0;
              auVar203._4_4_ = auVar173._4_4_ * 3.0;
              auVar203._8_4_ = auVar173._8_4_ * 3.0;
              auVar203._12_4_ = auVar173._12_4_ * 3.0;
              auVar173 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar220,local_a00._0_16_);
              auVar189 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00._0_16_,auVar220);
              fVar128 = auVar220._0_4_ * 6.0;
              fVar241 = auVar173._0_4_ * 6.0;
              fVar143 = auVar189._0_4_ * 6.0;
              fVar242 = local_a00._0_4_ * 6.0;
              auVar150._0_4_ = fVar242 * (float)local_af0._0_4_;
              auVar150._4_4_ = fVar242 * (float)local_af0._4_4_;
              auVar150._8_4_ = fVar242 * fStack_ae8;
              auVar150._12_4_ = fVar242 * fStack_ae4;
              auVar105._4_4_ = fVar143;
              auVar105._0_4_ = fVar143;
              auVar105._8_4_ = fVar143;
              auVar105._12_4_ = fVar143;
              auVar173 = vfmadd132ps_fma(auVar105,auVar150,local_ad0);
              auVar151._4_4_ = fVar241;
              auVar151._0_4_ = fVar241;
              auVar151._8_4_ = fVar241;
              auVar151._12_4_ = fVar241;
              auVar173 = vfmadd132ps_fma(auVar151,auVar173,local_ae0);
              auVar189 = vdpps_avx(auVar203,auVar203,0x7f);
              auVar106._4_4_ = fVar128;
              auVar106._0_4_ = fVar128;
              auVar106._8_4_ = fVar128;
              auVar106._12_4_ = fVar128;
              auVar133 = vfmadd132ps_fma(auVar106,auVar173,local_ac0);
              auVar173 = vblendps_avx(auVar189,_DAT_01f45a50,0xe);
              auVar220 = vrsqrtss_avx(auVar173,auVar173);
              fVar143 = auVar189._0_4_;
              fVar128 = auVar220._0_4_;
              auVar220 = vdpps_avx(auVar203,auVar133,0x7f);
              fVar128 = fVar128 * 1.5 + fVar143 * -0.5 * fVar128 * fVar128 * fVar128;
              auVar107._0_4_ = auVar133._0_4_ * fVar143;
              auVar107._4_4_ = auVar133._4_4_ * fVar143;
              auVar107._8_4_ = auVar133._8_4_ * fVar143;
              auVar107._12_4_ = auVar133._12_4_ * fVar143;
              fVar241 = auVar220._0_4_;
              auVar190._0_4_ = auVar203._0_4_ * fVar241;
              auVar190._4_4_ = auVar203._4_4_ * fVar241;
              auVar190._8_4_ = auVar203._8_4_ * fVar241;
              auVar190._12_4_ = auVar203._12_4_ * fVar241;
              auVar220 = vsubps_avx(auVar107,auVar190);
              auVar173 = vrcpss_avx(auVar173,auVar173);
              auVar133 = vfnmadd213ss_fma(auVar173,auVar189,ZEXT416(0x40000000));
              fVar241 = auVar173._0_4_ * auVar133._0_4_;
              auVar173 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                    ZEXT416((uint)(fVar148 * (float)local_900._0_4_)));
              auVar198 = ZEXT1664(auVar173);
              uVar60 = CONCAT44(auVar203._4_4_,auVar203._0_4_);
              auVar199._0_8_ = uVar60 ^ 0x8000000080000000;
              auVar199._8_4_ = -auVar203._8_4_;
              auVar199._12_4_ = -auVar203._12_4_;
              auVar152._0_4_ = fVar128 * auVar220._0_4_ * fVar241;
              auVar152._4_4_ = fVar128 * auVar220._4_4_ * fVar241;
              auVar152._8_4_ = fVar128 * auVar220._8_4_ * fVar241;
              auVar152._12_4_ = fVar128 * auVar220._12_4_ * fVar241;
              auVar249._0_4_ = auVar203._0_4_ * fVar128;
              auVar249._4_4_ = auVar203._4_4_ * fVar128;
              auVar249._8_4_ = auVar203._8_4_ * fVar128;
              auVar249._12_4_ = auVar203._12_4_ * fVar128;
              local_a00._0_16_ = auVar203;
              local_a20._0_4_ = auVar173._0_4_;
              if (fVar143 < -fVar143) {
                local_a40._0_4_ = auVar84._0_4_;
                local_9a0._0_16_ = auVar199;
                local_880._0_16_ = auVar249;
                local_a80._0_16_ = auVar152;
                fVar128 = sqrtf(fVar143);
                auVar84 = ZEXT416((uint)local_a40._0_4_);
                auVar198 = ZEXT464((uint)local_a20._0_4_);
                uVar74 = extraout_RAX_01;
                auVar152 = local_a80._0_16_;
                auVar199 = local_9a0._0_16_;
                auVar249 = local_880._0_16_;
              }
              else {
                auVar173 = vsqrtss_avx(auVar189,auVar189);
                fVar128 = auVar173._0_4_;
              }
              auVar173 = vdpps_avx(_local_860,auVar249,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar84,auVar198._0_16_);
              auVar189 = vdpps_avx(auVar199,auVar249,0x7f);
              auVar220 = vdpps_avx(_local_860,auVar152,0x7f);
              auVar133 = vdpps_avx((undefined1  [16])local_8a0,auVar249,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(auVar84._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_840._0_4_ / fVar128)),auVar4);
              fVar128 = auVar189._0_4_ + auVar220._0_4_;
              auVar85._0_4_ = auVar173._0_4_ * auVar173._0_4_;
              auVar85._4_4_ = auVar173._4_4_ * auVar173._4_4_;
              auVar85._8_4_ = auVar173._8_4_ * auVar173._8_4_;
              auVar85._12_4_ = auVar173._12_4_ * auVar173._12_4_;
              auVar189 = vdpps_avx(_local_860,auVar199,0x7f);
              auVar220 = vsubps_avx(auVar3,auVar85);
              auVar84 = vrsqrtss_avx(auVar220,auVar220);
              fVar143 = auVar220._0_4_;
              fVar241 = auVar84._0_4_;
              fVar241 = fVar241 * 1.5 + fVar143 * -0.5 * fVar241 * fVar241 * fVar241;
              auVar84 = vdpps_avx(_local_860,(undefined1  [16])local_8a0,0x7f);
              auVar189 = vfnmadd231ss_fma(auVar189,auVar173,ZEXT416((uint)fVar128));
              auVar84 = vfnmadd231ss_fma(auVar84,auVar173,auVar133);
              if (fVar143 < 0.0) {
                local_a40._0_16_ = auVar173;
                local_9a0._0_4_ = auVar4._0_4_;
                local_880._0_16_ = ZEXT416((uint)fVar128);
                local_a80._0_16_ = auVar133;
                local_8c0._0_16_ = auVar189;
                local_740._0_4_ = fVar241;
                local_760._0_16_ = auVar84;
                fVar143 = sqrtf(fVar143);
                auVar198 = ZEXT464((uint)local_a20._0_4_);
                uVar74 = extraout_RAX_02;
                fVar241 = (float)local_740._0_4_;
                auVar84 = local_760._0_16_;
                auVar189 = local_8c0._0_16_;
                auVar173 = local_a40._0_16_;
                auVar133 = local_a80._0_16_;
                auVar220 = local_880._0_16_;
                fVar128 = (float)local_9a0._0_4_;
              }
              else {
                auVar220 = vsqrtss_avx(auVar220,auVar220);
                fVar143 = auVar220._0_4_;
                auVar220 = ZEXT416((uint)fVar128);
                fVar128 = auVar4._0_4_;
              }
              auVar240 = ZEXT1664(auVar173);
              auVar4 = vpermilps_avx(local_720._0_16_,0xff);
              fVar143 = fVar143 - auVar4._0_4_;
              auVar4 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              auVar189 = vfmsub213ss_fma(auVar189,ZEXT416((uint)fVar241),auVar4);
              auVar153._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
              auVar153._8_4_ = auVar133._8_4_ ^ 0x80000000;
              auVar153._12_4_ = auVar133._12_4_ ^ 0x80000000;
              auVar174._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
              auVar174._8_4_ = auVar189._8_4_ ^ 0x80000000;
              auVar174._12_4_ = auVar189._12_4_ ^ 0x80000000;
              auVar130 = ZEXT416((uint)(auVar84._0_4_ * fVar241));
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar133._0_4_ * auVar189._0_4_)),auVar220,
                                        auVar130);
              auVar189 = vinsertps_avx(auVar174,auVar130,0x1c);
              uVar75 = auVar84._0_4_;
              auVar175._4_4_ = uVar75;
              auVar175._0_4_ = uVar75;
              auVar175._8_4_ = uVar75;
              auVar175._12_4_ = uVar75;
              auVar189 = vdivps_avx(auVar189,auVar175);
              auVar84 = vinsertps_avx(auVar220,auVar153,0x10);
              auVar84 = vdivps_avx(auVar84,auVar175);
              fVar241 = auVar173._0_4_;
              auVar131._0_4_ = fVar241 * auVar189._0_4_ + fVar143 * auVar84._0_4_;
              auVar131._4_4_ = fVar241 * auVar189._4_4_ + fVar143 * auVar84._4_4_;
              auVar131._8_4_ = fVar241 * auVar189._8_4_ + fVar143 * auVar84._8_4_;
              auVar131._12_4_ = fVar241 * auVar189._12_4_ + fVar143 * auVar84._12_4_;
              auVar8 = vsubps_avx(auVar8,auVar131);
              auVar189 = vandps_avx(auVar173,local_8e0._0_16_);
              if (auVar189._0_4_ < fVar128) {
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar198._0_4_ + fVar128)),local_780._0_16_
                                          ,ZEXT416(0x36000000));
                auVar189 = vandps_avx(ZEXT416((uint)fVar143),local_8e0._0_16_);
                if (auVar189._0_4_ < auVar84._0_4_) {
                  bVar78 = uVar77 < 5;
                  fVar128 = auVar8._0_4_ + (float)local_820._0_4_;
                  bVar68 = 0;
                  if ((fVar128 < (ray->org).field_0.m128[3]) ||
                     (fVar241 = ray->tfar, fVar241 < fVar128)) goto LAB_01366e4b;
                  auVar8 = vmovshdup_avx(auVar8);
                  fVar143 = auVar8._0_4_;
                  bVar68 = 0;
                  if ((fVar143 < 0.0) || (bVar68 = 0, 1.0 < fVar143)) goto LAB_01366e4b;
                  auVar8 = vrsqrtss_avx(auVar3,auVar3);
                  fVar242 = auVar8._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar70].ptr;
                  if ((pGVar6->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar68 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01366e4b;
                    fVar236 = fVar242 * 1.5 + fVar236 * -0.5 * fVar242 * fVar242 * fVar242;
                    auVar154._0_4_ = fVar236 * (float)local_860._0_4_;
                    auVar154._4_4_ = fVar236 * (float)local_860._4_4_;
                    auVar154._8_4_ = fVar236 * fStack_858;
                    auVar154._12_4_ = fVar236 * fStack_854;
                    auVar84 = vfmadd213ps_fma(auVar4,auVar154,local_a00._0_16_);
                    auVar8 = vshufps_avx(auVar154,auVar154,0xc9);
                    auVar3 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                    auVar155._0_4_ = auVar154._0_4_ * auVar3._0_4_;
                    auVar155._4_4_ = auVar154._4_4_ * auVar3._4_4_;
                    auVar155._8_4_ = auVar154._8_4_ * auVar3._8_4_;
                    auVar155._12_4_ = auVar154._12_4_ * auVar3._12_4_;
                    auVar189 = vfmsub231ps_fma(auVar155,local_a00._0_16_,auVar8);
                    auVar8 = vshufps_avx(auVar189,auVar189,0xc9);
                    auVar3 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar189 = vshufps_avx(auVar189,auVar189,0xd2);
                    auVar86._0_4_ = auVar84._0_4_ * auVar189._0_4_;
                    auVar86._4_4_ = auVar84._4_4_ * auVar189._4_4_;
                    auVar86._8_4_ = auVar84._8_4_ * auVar189._8_4_;
                    auVar86._12_4_ = auVar84._12_4_ * auVar189._12_4_;
                    auVar3 = vfmsub231ps_fma(auVar86,auVar8,auVar3);
                    auVar8 = vshufps_avx(auVar3,auVar3,0xe9);
                    local_9e0 = vmovlps_avx(auVar8);
                    local_9d8 = auVar3._0_4_;
                    local_9d0 = 0;
                    local_9cc = (undefined4)local_9a8;
                    local_9c4 = context->user->instID[0];
                    local_9c0 = context->user->instPrimID[0];
                    ray->tfar = fVar128;
                    local_6a0._0_4_ = 0xffffffff;
                    local_ab0.valid = (int *)local_6a0;
                    local_ab0.geometryUserPtr = pGVar6->userPtr;
                    local_ab0.context = context->user;
                    local_ab0.hit = (RTCHitN *)&local_9e0;
                    local_ab0.N = 1;
                    local_ab0.ray = (RTCRayN *)ray;
                    local_9d4 = fVar143;
                    local_9c8 = uVar70;
                    if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01367043:
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar240 = ZEXT1664(auVar240._0_16_);
                        (*p_Var7)(&local_ab0);
                        if (*local_ab0.valid == 0) goto LAB_0136707f;
                      }
                      bVar68 = 1;
                      goto LAB_01366e4b;
                    }
                    auVar240 = ZEXT1664(auVar173);
                    (*pGVar6->occlusionFilterN)(&local_ab0);
                    if (*local_ab0.valid != 0) goto LAB_01367043;
LAB_0136707f:
                    ray->tfar = fVar241;
                  }
                  bVar68 = 0;
                  goto LAB_01366e4b;
                }
              }
              uVar77 = uVar77 + 1;
            }
            bVar78 = false;
LAB_01366e4b:
            fVar236 = ray->tfar;
            auVar96._4_4_ = fVar236;
            auVar96._0_4_ = fVar236;
            auVar96._8_4_ = fVar236;
            auVar96._12_4_ = fVar236;
            auVar96._16_4_ = fVar236;
            auVar96._20_4_ = fVar236;
            auVar96._24_4_ = fVar236;
            auVar96._28_4_ = fVar236;
            bVar76 = bVar76 | bVar78 & bVar68;
            auVar253 = vcmpps_avx(_local_7e0,auVar96,2);
            auVar253 = vandps_avx(auVar253,local_4a0);
          }
          auVar97._0_4_ = local_7c0._0_4_ + (float)local_6c0._0_4_;
          auVar97._4_4_ = local_7c0._4_4_ + (float)local_6c0._4_4_;
          auVar97._8_4_ = local_7c0._8_4_ + fStack_6b8;
          auVar97._12_4_ = local_7c0._12_4_ + fStack_6b4;
          auVar97._16_4_ = local_7c0._16_4_ + fStack_6b0;
          auVar97._20_4_ = local_7c0._20_4_ + fStack_6ac;
          auVar97._24_4_ = local_7c0._24_4_ + fStack_6a8;
          auVar97._28_4_ = local_7c0._28_4_ + fStack_6a4;
          fVar128 = ray->tfar;
          fVar236 = ray->tfar;
          auVar140._4_4_ = fVar236;
          auVar140._0_4_ = fVar236;
          auVar140._8_4_ = fVar236;
          auVar140._12_4_ = fVar236;
          auVar140._16_4_ = fVar236;
          auVar140._20_4_ = fVar236;
          auVar140._24_4_ = fVar236;
          auVar140._28_4_ = fVar236;
          auVar253 = vcmpps_avx(auVar97,auVar140,2);
          _local_7e0 = vandps_avx(auVar253,local_800);
          auVar98._8_4_ = 3;
          auVar98._0_8_ = 0x300000003;
          auVar98._12_4_ = 3;
          auVar98._16_4_ = 3;
          auVar98._20_4_ = 3;
          auVar98._24_4_ = 3;
          auVar98._28_4_ = 3;
          auVar141._8_4_ = 2;
          auVar141._0_8_ = 0x200000002;
          auVar141._12_4_ = 2;
          auVar141._16_4_ = 2;
          auVar141._20_4_ = 2;
          auVar141._24_4_ = 2;
          auVar141._28_4_ = 2;
          auVar253 = vblendvps_avx(auVar141,auVar98,local_660);
          local_800 = vpcmpgtd_avx2(auVar253,local_680);
          local_6a0 = vpandn_avx2(local_800,_local_7e0);
          local_700 = _local_5a0;
          local_7c0._4_4_ = (float)local_6c0._4_4_ + (float)local_5a0._4_4_;
          local_7c0._0_4_ = (float)local_6c0._0_4_ + (float)local_5a0._0_4_;
          fStack_7b8 = fStack_6b8 + fStack_598;
          fStack_7b4 = fStack_6b4 + fStack_594;
          fStack_7b0 = fStack_6b0 + fStack_590;
          fStack_7ac = fStack_6ac + fStack_58c;
          fStack_7a8 = fStack_6a8 + fStack_588;
          fStack_7a4 = fStack_6a4 + fStack_584;
          auVar254 = ZEXT3264(local_920);
          auVar227 = ZEXT3264(local_940);
          auVar219 = ZEXT3264(local_a60);
          auVar272 = ZEXT3264(local_960);
          auVar214 = ZEXT3264(local_980);
          auVar198 = ZEXT3264(local_b20);
          while( true ) {
            auVar258 = auVar227._0_32_;
            if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                  (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_6a0[0x1f]) break;
            auVar121._8_4_ = 0x7f800000;
            auVar121._0_8_ = 0x7f8000007f800000;
            auVar121._12_4_ = 0x7f800000;
            auVar121._16_4_ = 0x7f800000;
            auVar121._20_4_ = 0x7f800000;
            auVar121._24_4_ = 0x7f800000;
            auVar121._28_4_ = 0x7f800000;
            auVar253 = vblendvps_avx(auVar121,local_700,local_6a0);
            auVar9 = vshufps_avx(auVar253,auVar253,0xb1);
            auVar9 = vminps_avx(auVar253,auVar9);
            auVar117 = vshufpd_avx(auVar9,auVar9,5);
            auVar9 = vminps_avx(auVar9,auVar117);
            auVar117 = vpermpd_avx2(auVar9,0x4e);
            auVar9 = vminps_avx(auVar9,auVar117);
            auVar9 = vcmpps_avx(auVar253,auVar9,0);
            auVar117 = local_6a0 & auVar9;
            auVar253 = local_6a0;
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0x7f,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0xbf,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar117[0x1f] < '\0') {
              auVar253 = vandps_avx(auVar9,local_6a0);
            }
            uVar69 = vmovmskps_avx(auVar253);
            iVar13 = 0;
            for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar74 = (ulong)(uint)(iVar13 << 2);
            *(undefined4 *)(local_6a0 + uVar74) = 0;
            local_8a0 = (ray->dir).field_0;
            auVar8 = vdpps_avx((undefined1  [16])local_8a0,(undefined1  [16])local_8a0,0x7f);
            uVar69 = *(uint *)(local_1c0 + uVar74);
            uVar73 = *(uint *)(local_580 + uVar74);
            if (auVar8._0_4_ < 0.0) {
              auVar240 = ZEXT1664(auVar240._0_16_);
              fVar236 = sqrtf(auVar8._0_4_);
              auVar214 = ZEXT3264(local_980);
              auVar272 = ZEXT3264(local_960);
              auVar219 = ZEXT3264(local_a60);
              auVar227 = ZEXT3264(local_940);
              auVar254 = ZEXT3264(local_920);
              uVar74 = extraout_RAX_03;
            }
            else {
              auVar8 = vsqrtss_avx(auVar8,auVar8);
              fVar236 = auVar8._0_4_;
            }
            auVar3 = vminps_avx(local_ac0,local_ae0);
            auVar8 = vmaxps_avx(local_ac0,local_ae0);
            auVar173 = vminps_avx(local_ad0,_local_af0);
            auVar189 = vminps_avx(auVar3,auVar173);
            auVar3 = vmaxps_avx(local_ad0,_local_af0);
            auVar173 = vmaxps_avx(auVar8,auVar3);
            local_9a0._8_4_ = 0x7fffffff;
            local_9a0._0_8_ = 0x7fffffff7fffffff;
            local_9a0._12_4_ = 0x7fffffff;
            auVar8 = vandps_avx(auVar189,local_9a0._0_16_);
            auVar3 = vandps_avx(auVar173,local_9a0._0_16_);
            auVar8 = vmaxps_avx(auVar8,auVar3);
            auVar3 = vmovshdup_avx(auVar8);
            auVar3 = vmaxss_avx(auVar3,auVar8);
            auVar8 = vshufpd_avx(auVar8,auVar8,1);
            auVar8 = vmaxss_avx(auVar8,auVar3);
            local_840._0_4_ = auVar8._0_4_ * 1.9073486e-06;
            local_880._0_4_ = fVar236 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar173,auVar173,0xff);
            auVar8 = vinsertps_avx(ZEXT416(uVar73),ZEXT416(uVar69),0x10);
            uVar77 = 0;
            while( true ) {
              bVar68 = (byte)uVar74;
              auVar198 = ZEXT3264(local_b20);
              if (uVar77 == 5) break;
              local_a00._0_16_ = vmovshdup_avx(auVar8);
              fVar242 = 1.0 - local_a00._0_4_;
              auVar3 = vshufps_avx(auVar8,auVar8,0x55);
              fVar236 = auVar3._0_4_;
              auVar108._0_4_ = local_ae0._0_4_ * fVar236;
              fVar128 = auVar3._4_4_;
              auVar108._4_4_ = local_ae0._4_4_ * fVar128;
              fVar241 = auVar3._8_4_;
              auVar108._8_4_ = local_ae0._8_4_ * fVar241;
              fVar143 = auVar3._12_4_;
              auVar108._12_4_ = local_ae0._12_4_ * fVar143;
              auVar132._4_4_ = fVar242;
              auVar132._0_4_ = fVar242;
              auVar132._8_4_ = fVar242;
              auVar132._12_4_ = fVar242;
              auVar3 = vfmadd231ps_fma(auVar108,auVar132,local_ac0);
              auVar156._0_4_ = local_ad0._0_4_ * fVar236;
              auVar156._4_4_ = local_ad0._4_4_ * fVar128;
              auVar156._8_4_ = local_ad0._8_4_ * fVar241;
              auVar156._12_4_ = local_ad0._12_4_ * fVar143;
              auVar173 = vfmadd231ps_fma(auVar156,auVar132,local_ae0);
              auVar191._0_4_ = fVar236 * auVar173._0_4_;
              auVar191._4_4_ = fVar128 * auVar173._4_4_;
              auVar191._8_4_ = fVar241 * auVar173._8_4_;
              auVar191._12_4_ = fVar143 * auVar173._12_4_;
              auVar189 = vfmadd231ps_fma(auVar191,auVar132,auVar3);
              auVar109._0_4_ = fVar236 * (float)local_af0._0_4_;
              auVar109._4_4_ = fVar128 * (float)local_af0._4_4_;
              auVar109._8_4_ = fVar241 * fStack_ae8;
              auVar109._12_4_ = fVar143 * fStack_ae4;
              auVar3 = vfmadd231ps_fma(auVar109,auVar132,local_ad0);
              auVar176._0_4_ = fVar236 * auVar3._0_4_;
              auVar176._4_4_ = fVar128 * auVar3._4_4_;
              auVar176._8_4_ = fVar241 * auVar3._8_4_;
              auVar176._12_4_ = fVar143 * auVar3._12_4_;
              auVar173 = vfmadd231ps_fma(auVar176,auVar132,auVar173);
              fVar148 = auVar8._0_4_;
              auVar110._4_4_ = fVar148;
              auVar110._0_4_ = fVar148;
              auVar110._8_4_ = fVar148;
              auVar110._12_4_ = fVar148;
              auVar3 = vfmadd213ps_fma(auVar110,(undefined1  [16])local_8a0,_DAT_01f45a50);
              auVar87._0_4_ = fVar236 * auVar173._0_4_;
              auVar87._4_4_ = fVar128 * auVar173._4_4_;
              auVar87._8_4_ = fVar241 * auVar173._8_4_;
              auVar87._12_4_ = fVar143 * auVar173._12_4_;
              auVar84 = vfmadd231ps_fma(auVar87,auVar189,auVar132);
              local_720._0_16_ = auVar84;
              auVar3 = vsubps_avx(auVar3,auVar84);
              _local_860 = auVar3;
              auVar3 = vdpps_avx(auVar3,auVar3,0x7f);
              fVar236 = auVar3._0_4_;
              if (fVar236 < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar242);
                local_8e0._0_16_ = auVar189;
                local_900._0_16_ = auVar173;
                auVar272._0_4_ = sqrtf(fVar236);
                auVar272._4_60_ = extraout_var_00;
                auVar84 = auVar272._0_16_;
                uVar74 = extraout_RAX_04;
                auVar173 = local_900._0_16_;
                auVar189 = local_8e0._0_16_;
                auVar220 = local_a20._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar3,auVar3);
                auVar220 = ZEXT416((uint)fVar242);
              }
              auVar173 = vsubps_avx(auVar173,auVar189);
              auVar204._0_4_ = auVar173._0_4_ * 3.0;
              auVar204._4_4_ = auVar173._4_4_ * 3.0;
              auVar204._8_4_ = auVar173._8_4_ * 3.0;
              auVar204._12_4_ = auVar173._12_4_ * 3.0;
              auVar173 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar220,local_a00._0_16_);
              auVar189 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00._0_16_,auVar220);
              fVar128 = auVar220._0_4_ * 6.0;
              fVar241 = auVar173._0_4_ * 6.0;
              fVar143 = auVar189._0_4_ * 6.0;
              fVar242 = local_a00._0_4_ * 6.0;
              auVar157._0_4_ = fVar242 * (float)local_af0._0_4_;
              auVar157._4_4_ = fVar242 * (float)local_af0._4_4_;
              auVar157._8_4_ = fVar242 * fStack_ae8;
              auVar157._12_4_ = fVar242 * fStack_ae4;
              auVar111._4_4_ = fVar143;
              auVar111._0_4_ = fVar143;
              auVar111._8_4_ = fVar143;
              auVar111._12_4_ = fVar143;
              auVar173 = vfmadd132ps_fma(auVar111,auVar157,local_ad0);
              auVar158._4_4_ = fVar241;
              auVar158._0_4_ = fVar241;
              auVar158._8_4_ = fVar241;
              auVar158._12_4_ = fVar241;
              auVar173 = vfmadd132ps_fma(auVar158,auVar173,local_ae0);
              auVar189 = vdpps_avx(auVar204,auVar204,0x7f);
              auVar112._4_4_ = fVar128;
              auVar112._0_4_ = fVar128;
              auVar112._8_4_ = fVar128;
              auVar112._12_4_ = fVar128;
              auVar133 = vfmadd132ps_fma(auVar112,auVar173,local_ac0);
              auVar173 = vblendps_avx(auVar189,_DAT_01f45a50,0xe);
              auVar220 = vrsqrtss_avx(auVar173,auVar173);
              fVar143 = auVar189._0_4_;
              fVar128 = auVar220._0_4_;
              auVar220 = vdpps_avx(auVar204,auVar133,0x7f);
              fVar128 = fVar128 * 1.5 + fVar143 * -0.5 * fVar128 * fVar128 * fVar128;
              auVar113._0_4_ = auVar133._0_4_ * fVar143;
              auVar113._4_4_ = auVar133._4_4_ * fVar143;
              auVar113._8_4_ = auVar133._8_4_ * fVar143;
              auVar113._12_4_ = auVar133._12_4_ * fVar143;
              fVar241 = auVar220._0_4_;
              auVar192._0_4_ = auVar204._0_4_ * fVar241;
              auVar192._4_4_ = auVar204._4_4_ * fVar241;
              auVar192._8_4_ = auVar204._8_4_ * fVar241;
              auVar192._12_4_ = auVar204._12_4_ * fVar241;
              auVar220 = vsubps_avx(auVar113,auVar192);
              auVar173 = vrcpss_avx(auVar173,auVar173);
              auVar133 = vfnmadd213ss_fma(auVar173,auVar189,ZEXT416(0x40000000));
              fVar241 = auVar173._0_4_ * auVar133._0_4_;
              auVar173 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                    ZEXT416((uint)(fVar148 * (float)local_880._0_4_)));
              uVar60 = CONCAT44(auVar204._4_4_,auVar204._0_4_);
              auVar221._0_8_ = uVar60 ^ 0x8000000080000000;
              auVar221._8_4_ = -auVar204._8_4_;
              auVar221._12_4_ = -auVar204._12_4_;
              auVar159._0_4_ = fVar128 * auVar220._0_4_ * fVar241;
              auVar159._4_4_ = fVar128 * auVar220._4_4_ * fVar241;
              auVar159._8_4_ = fVar128 * auVar220._8_4_ * fVar241;
              auVar159._12_4_ = fVar128 * auVar220._12_4_ * fVar241;
              local_a40._0_4_ = auVar204._0_4_ * fVar128;
              local_a40._4_4_ = auVar204._4_4_ * fVar128;
              local_a40._8_4_ = auVar204._8_4_ * fVar128;
              local_a40._12_4_ = auVar204._12_4_ * fVar128;
              local_a00._0_16_ = auVar204;
              local_a20._0_4_ = auVar173._0_4_;
              if (fVar143 < -fVar143) {
                local_8e0._0_4_ = auVar84._0_4_;
                local_900._0_16_ = auVar221;
                local_a80._0_16_ = auVar159;
                fVar128 = sqrtf(fVar143);
                auVar84 = ZEXT416((uint)local_8e0._0_4_);
                auVar173 = ZEXT416((uint)local_a20._0_4_);
                uVar74 = extraout_RAX_05;
                auVar159 = local_a80._0_16_;
                auVar221 = local_900._0_16_;
              }
              else {
                auVar189 = vsqrtss_avx(auVar189,auVar189);
                fVar128 = auVar189._0_4_;
              }
              local_8e0._0_16_ = vdpps_avx(_local_860,local_a40._0_16_,0x7f);
              auVar133 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar84,auVar173);
              auVar173 = vdpps_avx(auVar221,local_a40._0_16_,0x7f);
              auVar189 = vdpps_avx(_local_860,auVar159,0x7f);
              auVar220 = vdpps_avx((undefined1  [16])local_8a0,local_a40._0_16_,0x7f);
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)(auVar84._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_840._0_4_ / fVar128)),auVar133);
              local_900._0_4_ = auVar84._0_4_;
              auVar88._0_4_ = local_8e0._0_4_ * local_8e0._0_4_;
              auVar88._4_4_ = local_8e0._4_4_ * local_8e0._4_4_;
              auVar88._8_4_ = local_8e0._8_4_ * local_8e0._8_4_;
              auVar88._12_4_ = local_8e0._12_4_ * local_8e0._12_4_;
              auVar84 = vdpps_avx(_local_860,auVar221,0x7f);
              auVar4 = vsubps_avx(auVar3,auVar88);
              auVar133 = vrsqrtss_avx(auVar4,auVar4);
              fVar241 = auVar4._0_4_;
              fVar128 = auVar133._0_4_;
              fVar128 = fVar128 * 1.5 + fVar241 * -0.5 * fVar128 * fVar128 * fVar128;
              auVar133 = vdpps_avx(_local_860,(undefined1  [16])local_8a0,0x7f);
              local_a40._0_16_ = ZEXT416((uint)(auVar173._0_4_ + auVar189._0_4_));
              auVar173 = vfnmadd231ss_fma(auVar84,local_8e0._0_16_,local_a40._0_16_);
              auVar189 = vfnmadd231ss_fma(auVar133,local_8e0._0_16_,auVar220);
              if (fVar241 < 0.0) {
                local_a80._0_16_ = auVar220;
                local_8c0._0_16_ = auVar173;
                local_740._0_4_ = fVar128;
                local_760._0_16_ = auVar189;
                fVar241 = sqrtf(fVar241);
                uVar74 = extraout_RAX_06;
                fVar128 = (float)local_740._0_4_;
                auVar189 = local_760._0_16_;
                auVar173 = local_8c0._0_16_;
                auVar220 = local_a80._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar4,auVar4);
                fVar241 = auVar84._0_4_;
              }
              auVar240 = ZEXT1664(auVar3);
              auVar254 = ZEXT3264(local_920);
              auVar227 = ZEXT3264(local_940);
              auVar219 = ZEXT3264(local_a60);
              auVar272 = ZEXT3264(local_960);
              auVar214 = ZEXT3264(local_980);
              auVar84 = vpermilps_avx(local_720._0_16_,0xff);
              fVar241 = fVar241 - auVar84._0_4_;
              auVar84 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              auVar173 = vfmsub213ss_fma(auVar173,ZEXT416((uint)fVar128),auVar84);
              auVar160._0_8_ = auVar220._0_8_ ^ 0x8000000080000000;
              auVar160._8_4_ = auVar220._8_4_ ^ 0x80000000;
              auVar160._12_4_ = auVar220._12_4_ ^ 0x80000000;
              auVar177._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
              auVar177._8_4_ = auVar173._8_4_ ^ 0x80000000;
              auVar177._12_4_ = auVar173._12_4_ ^ 0x80000000;
              auVar133 = ZEXT416((uint)(auVar189._0_4_ * fVar128));
              auVar189 = vfmsub231ss_fma(ZEXT416((uint)(auVar220._0_4_ * auVar173._0_4_)),
                                         local_a40._0_16_,auVar133);
              auVar173 = vinsertps_avx(auVar177,auVar133,0x1c);
              uVar75 = auVar189._0_4_;
              auVar178._4_4_ = uVar75;
              auVar178._0_4_ = uVar75;
              auVar178._8_4_ = uVar75;
              auVar178._12_4_ = uVar75;
              auVar173 = vdivps_avx(auVar173,auVar178);
              auVar189 = vinsertps_avx(local_a40._0_16_,auVar160,0x10);
              auVar189 = vdivps_avx(auVar189,auVar178);
              fVar128 = local_8e0._0_4_;
              auVar134._0_4_ = fVar128 * auVar173._0_4_ + fVar241 * auVar189._0_4_;
              auVar134._4_4_ = fVar128 * auVar173._4_4_ + fVar241 * auVar189._4_4_;
              auVar134._8_4_ = fVar128 * auVar173._8_4_ + fVar241 * auVar189._8_4_;
              auVar134._12_4_ = fVar128 * auVar173._12_4_ + fVar241 * auVar189._12_4_;
              auVar8 = vsubps_avx(auVar8,auVar134);
              auVar173 = vandps_avx(local_8e0._0_16_,local_9a0._0_16_);
              if (auVar173._0_4_ < (float)local_900._0_4_) {
                auVar189 = vfmadd231ss_fma(ZEXT416((uint)((float)local_900._0_4_ +
                                                         (float)local_a20._0_4_)),local_780._0_16_,
                                           ZEXT416(0x36000000));
                auVar173 = vandps_avx(ZEXT416((uint)fVar241),local_9a0._0_16_);
                if (auVar173._0_4_ < auVar189._0_4_) {
                  bVar78 = uVar77 < 5;
                  fVar128 = auVar8._0_4_ + (float)local_820._0_4_;
                  auVar198 = ZEXT3264(local_b20);
                  bVar68 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar128) &&
                     (fVar241 = ray->tfar, fVar128 <= fVar241)) {
                    auVar8 = vmovshdup_avx(auVar8);
                    fVar143 = auVar8._0_4_;
                    bVar68 = 0;
                    if ((0.0 <= fVar143) && (bVar68 = 0, fVar143 <= 1.0)) {
                      auVar8 = vrsqrtss_avx(auVar3,auVar3);
                      fVar242 = auVar8._0_4_;
                      pGVar6 = (context->scene->geometries).items[uVar70].ptr;
                      if ((pGVar6->mask & ray->mask) == 0) {
                        bVar68 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar68 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar236 = fVar242 * 1.5 + fVar236 * -0.5 * fVar242 * fVar242 * fVar242;
                        auVar161._0_4_ = fVar236 * (float)local_860._0_4_;
                        auVar161._4_4_ = fVar236 * (float)local_860._4_4_;
                        auVar161._8_4_ = fVar236 * fStack_858;
                        auVar161._12_4_ = fVar236 * fStack_854;
                        auVar84 = vfmadd213ps_fma(auVar84,auVar161,local_a00._0_16_);
                        auVar8 = vshufps_avx(auVar161,auVar161,0xc9);
                        auVar173 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                        auVar162._0_4_ = auVar161._0_4_ * auVar173._0_4_;
                        auVar162._4_4_ = auVar161._4_4_ * auVar173._4_4_;
                        auVar162._8_4_ = auVar161._8_4_ * auVar173._8_4_;
                        auVar162._12_4_ = auVar161._12_4_ * auVar173._12_4_;
                        auVar189 = vfmsub231ps_fma(auVar162,local_a00._0_16_,auVar8);
                        auVar8 = vshufps_avx(auVar189,auVar189,0xc9);
                        auVar173 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar189 = vshufps_avx(auVar189,auVar189,0xd2);
                        auVar89._0_4_ = auVar84._0_4_ * auVar189._0_4_;
                        auVar89._4_4_ = auVar84._4_4_ * auVar189._4_4_;
                        auVar89._8_4_ = auVar84._8_4_ * auVar189._8_4_;
                        auVar89._12_4_ = auVar84._12_4_ * auVar189._12_4_;
                        auVar173 = vfmsub231ps_fma(auVar89,auVar8,auVar173);
                        auVar8 = vshufps_avx(auVar173,auVar173,0xe9);
                        local_9e0 = vmovlps_avx(auVar8);
                        local_9d8 = auVar173._0_4_;
                        local_9d0 = 0;
                        local_9cc = (undefined4)local_9a8;
                        local_9c4 = context->user->instID[0];
                        local_9c0 = context->user->instPrimID[0];
                        ray->tfar = fVar128;
                        local_b24 = -1;
                        local_ab0.valid = &local_b24;
                        local_ab0.geometryUserPtr = pGVar6->userPtr;
                        local_ab0.context = context->user;
                        local_ab0.hit = (RTCHitN *)&local_9e0;
                        local_ab0.N = 1;
                        local_ab0.ray = (RTCRayN *)ray;
                        local_9d4 = fVar143;
                        local_9c8 = uVar70;
                        if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013679bf:
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            (*p_Var7)(&local_ab0);
                            if (*local_ab0.valid == 0) goto LAB_01367a10;
                          }
                          bVar68 = 1;
                        }
                        else {
                          auVar240 = ZEXT1664(auVar3);
                          (*pGVar6->occlusionFilterN)(&local_ab0);
                          if (*local_ab0.valid != 0) goto LAB_013679bf;
LAB_01367a10:
                          ray->tfar = fVar241;
                          bVar68 = 0;
                        }
                        auVar254 = ZEXT3264(local_920);
                        auVar227 = ZEXT3264(local_940);
                        auVar219 = ZEXT3264(local_a60);
                        auVar272 = ZEXT3264(local_960);
                        auVar214 = ZEXT3264(local_980);
                      }
                      auVar198 = ZEXT3264(local_b20);
                    }
                  }
                  goto LAB_013677c6;
                }
              }
              uVar77 = uVar77 + 1;
            }
            bVar78 = false;
LAB_013677c6:
            bVar76 = bVar76 | bVar78 & bVar68;
            fVar236 = ray->tfar;
            auVar99._4_4_ = fVar236;
            auVar99._0_4_ = fVar236;
            auVar99._8_4_ = fVar236;
            auVar99._12_4_ = fVar236;
            auVar99._16_4_ = fVar236;
            auVar99._20_4_ = fVar236;
            auVar99._24_4_ = fVar236;
            auVar99._28_4_ = fVar236;
            fVar128 = ray->tfar;
            auVar253 = vcmpps_avx(_local_7c0,auVar99,2);
            local_6a0 = vandps_avx(auVar253,local_6a0);
          }
          auVar142._0_4_ = (float)local_6c0._0_4_ + local_560._0_4_;
          auVar142._4_4_ = (float)local_6c0._4_4_ + local_560._4_4_;
          auVar142._8_4_ = fStack_6b8 + local_560._8_4_;
          auVar142._12_4_ = fStack_6b4 + local_560._12_4_;
          auVar142._16_4_ = fStack_6b0 + local_560._16_4_;
          auVar142._20_4_ = fStack_6ac + local_560._20_4_;
          auVar142._24_4_ = fStack_6a8 + local_560._24_4_;
          auVar142._28_4_ = fStack_6a4 + local_560._28_4_;
          auVar171._4_4_ = fVar128;
          auVar171._0_4_ = fVar128;
          auVar171._8_4_ = fVar128;
          auVar171._12_4_ = fVar128;
          auVar171._16_4_ = fVar128;
          auVar171._20_4_ = fVar128;
          auVar171._24_4_ = fVar128;
          auVar171._28_4_ = fVar128;
          auVar9 = vcmpps_avx(auVar142,auVar171,2);
          auVar253 = vandps_avx(local_640,local_620);
          auVar253 = vandps_avx(auVar9,auVar253);
          auVar184._0_4_ = (float)local_6c0._0_4_ + local_5a0._0_4_;
          auVar184._4_4_ = (float)local_6c0._4_4_ + local_5a0._4_4_;
          auVar184._8_4_ = fStack_6b8 + local_5a0._8_4_;
          auVar184._12_4_ = fStack_6b4 + local_5a0._12_4_;
          auVar184._16_4_ = fStack_6b0 + local_5a0._16_4_;
          auVar184._20_4_ = fStack_6ac + local_5a0._20_4_;
          auVar184._24_4_ = fStack_6a8 + local_5a0._24_4_;
          auVar184._28_4_ = fStack_6a4 + local_5a0._28_4_;
          auVar117 = vcmpps_avx(auVar184,auVar171,2);
          auVar9 = vandps_avx(local_800,_local_7e0);
          auVar9 = vandps_avx(auVar117,auVar9);
          auVar9 = vorps_avx(auVar253,auVar9);
          if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0x7f,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0xbf,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar9[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar71 * 0x60) = auVar9;
            auVar253 = vblendvps_avx(_local_5a0,local_560,auVar253);
            *(undefined1 (*) [32])(auStack_160 + uVar71 * 0x60) = auVar253;
            uVar74 = vmovlps_avx(local_5b0);
            (&uStack_140)[uVar71 * 0xc] = uVar74;
            aiStack_138[uVar71 * 0x18] = local_b84 + 1;
            uVar71 = (ulong)((int)uVar71 + 1);
          }
          auVar253 = auVar254._0_32_;
          goto LAB_0136664a;
        }
      }
      auVar219 = ZEXT3264(local_a60);
      auVar272 = ZEXT3264(local_960);
      auVar214 = ZEXT3264(local_980);
      auVar198 = ZEXT3264(local_b20);
    }
LAB_0136664a:
    fVar236 = ray->tfar;
    auVar92._4_4_ = fVar236;
    auVar92._0_4_ = fVar236;
    auVar92._8_4_ = fVar236;
    auVar92._12_4_ = fVar236;
    auVar92._16_4_ = fVar236;
    auVar92._20_4_ = fVar236;
    auVar92._24_4_ = fVar236;
    auVar92._28_4_ = fVar236;
    while( true ) {
      uVar69 = (uint)uVar71;
      if (uVar69 == 0) {
        if (bVar76 != 0) goto LAB_01367c36;
        auVar253 = vcmpps_avx(local_3c0,auVar92,2);
        uVar70 = vmovmskps_avx(auVar253);
        local_808 = (ulong)((uint)local_810 & uVar70);
        goto LAB_0136579e;
      }
      uVar71 = (ulong)(uVar69 - 1);
      lVar72 = uVar71 * 0x60;
      auVar9 = *(undefined1 (*) [32])(auStack_160 + lVar72);
      auVar116._0_4_ = auVar9._0_4_ + (float)local_6c0._0_4_;
      auVar116._4_4_ = auVar9._4_4_ + (float)local_6c0._4_4_;
      auVar116._8_4_ = auVar9._8_4_ + fStack_6b8;
      auVar116._12_4_ = auVar9._12_4_ + fStack_6b4;
      auVar116._16_4_ = auVar9._16_4_ + fStack_6b0;
      auVar116._20_4_ = auVar9._20_4_ + fStack_6ac;
      auVar116._24_4_ = auVar9._24_4_ + fStack_6a8;
      auVar116._28_4_ = auVar9._28_4_ + fStack_6a4;
      auVar10 = vcmpps_avx(auVar116,auVar92,2);
      auVar117 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar72));
      local_560 = auVar117;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar72) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar71 = (ulong)(uVar69 - 1);
    }
    auVar93._8_4_ = 0x7f800000;
    auVar93._0_8_ = 0x7f8000007f800000;
    auVar93._12_4_ = 0x7f800000;
    auVar93._16_4_ = 0x7f800000;
    auVar93._20_4_ = 0x7f800000;
    auVar93._24_4_ = 0x7f800000;
    auVar93._28_4_ = 0x7f800000;
    auVar9 = vblendvps_avx(auVar93,auVar9,auVar117);
    auVar10 = vshufps_avx(auVar9,auVar9,0xb1);
    auVar10 = vminps_avx(auVar9,auVar10);
    auVar11 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar11 = vpermpd_avx2(auVar10,0x4e);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar9 = vcmpps_avx(auVar9,auVar10,0);
    auVar10 = auVar117 & auVar9;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar117 = vandps_avx(auVar9,auVar117);
    }
    uVar73 = vmovmskps_avx(auVar117);
    iVar13 = 0;
    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
      iVar13 = iVar13 + 1;
    }
    *(undefined4 *)(local_560 + (uint)(iVar13 << 2)) = 0;
    uVar74 = (&uStack_140)[uVar71 * 0xc];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar74;
    local_b84 = aiStack_138[uVar71 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar72) = local_560;
    uVar73 = uVar69 - 1;
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_560 >> 0x7f,0) != '\0') ||
          (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_560 >> 0xbf,0) != '\0') ||
        (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_560[0x1f] < '\0') {
      uVar73 = uVar69;
    }
    uVar75 = (undefined4)uVar74;
    auVar118._4_4_ = uVar75;
    auVar118._0_4_ = uVar75;
    auVar118._8_4_ = uVar75;
    auVar118._12_4_ = uVar75;
    auVar118._16_4_ = uVar75;
    auVar118._20_4_ = uVar75;
    auVar118._24_4_ = uVar75;
    auVar118._28_4_ = uVar75;
    auVar8 = vmovshdup_avx(auVar82);
    auVar8 = vsubps_avx(auVar8,auVar82);
    auVar94._0_4_ = auVar8._0_4_;
    auVar94._4_4_ = auVar94._0_4_;
    auVar94._8_4_ = auVar94._0_4_;
    auVar94._12_4_ = auVar94._0_4_;
    auVar94._16_4_ = auVar94._0_4_;
    auVar94._20_4_ = auVar94._0_4_;
    auVar94._24_4_ = auVar94._0_4_;
    auVar94._28_4_ = auVar94._0_4_;
    auVar8 = vfmadd132ps_fma(auVar94,auVar118,_DAT_01f7b040);
    _local_5a0 = ZEXT1632(auVar8);
    local_5b0._8_8_ = 0;
    local_5b0._0_8_ = *(ulong *)(local_5a0 + (uint)(iVar13 << 2));
    uVar71 = (ulong)uVar73;
    auVar212 = auVar214._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }